

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::Li
          (VolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  Vector3f *this_00;
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar14;
  Interval<float> IVar12;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *pTVar13;
  undefined4 uVar20;
  undefined4 uVar21;
  ulong uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  byte bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  anon_class_24_3_20c75c41 func;
  anon_class_24_3_20c75c41 func_00;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  Vector3f wiRender;
  undefined1 auVar104 [16];
  Interaction *pIVar105;
  bool bVar106;
  bool bVar107;
  bool bVar108;
  ShapeIntersection *pSVar109;
  uint64_t uVar110;
  uint64_t seed;
  SurfaceInteraction *pSVar111;
  MediumInteraction *pMVar112;
  ShapeIntersection *pSVar113;
  float *pfVar114;
  float *pfVar115;
  float *pfVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  SamplerHandle *pSVar120;
  int iVar121;
  int iVar122;
  long lVar123;
  int *piVar124;
  int *piVar125;
  LightHandle *light;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar126;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *this_01;
  DenselySampledSpectrum *this_02;
  ulong uVar127;
  RayDifferential *ray_00;
  long in_FS_OFFSET;
  undefined1 in_ZmmResult [64];
  undefined1 auVar135 [48];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  Float FVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  type tVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [64];
  undefined1 auVar249 [56];
  undefined1 auVar146 [64];
  undefined1 auVar250 [56];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 extraout_var_05 [56];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 extraout_var_06 [56];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 extraout_var_07 [56];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 extraout_var_08 [56];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar258 [12];
  undefined1 in_ZMM1 [64];
  undefined1 auVar259 [60];
  undefined1 auVar252 [64];
  float fVar251;
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  float fVar260;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar271;
  undefined1 in_ZMM5 [64];
  float fVar272;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 in_ZMM12 [64];
  float fVar279;
  float fVar280;
  undefined1 in_XMM16 [16];
  Vector3<float> VVar281;
  Point3f PVar282;
  Point3<float> PVar283;
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f woRender_01;
  anon_class_16_2_d8f97178 func_01;
  anon_class_16_2_2793a994 func_02;
  anon_class_16_2_d8f97178 func_03;
  anon_class_16_2_a5d7db33 func_04;
  SampledSpectrum SVar284;
  bool specularBounce;
  bool anyNonSpecularBounces;
  bool terminated;
  bool scattered;
  undefined1 local_8b8 [16];
  float local_8a4;
  int depth;
  float local_89c;
  RayDifferential *local_898;
  Float tMax;
  Float tMin;
  float local_884;
  int voxel [3];
  float nextCrossingT [3];
  undefined1 local_858 [56];
  Tuple3<pbrt::Point3,_float> local_820;
  SampledSpectrum pdfUni;
  SampledSpectrum beta;
  BSSRDFHandle bssrdf;
  int voxelLimit [3];
  int step [3];
  float deltaT [3];
  SampledSpectrum sigma_a_3;
  float local_7a8;
  float fStack_7a4;
  Float local_7a0;
  MediumHandle local_798;
  undefined8 local_790;
  Tuple3<pbrt::Normal3,_float> TStack_788;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  undefined8 uStack_76c;
  Tuple3<pbrt::Vector3,_float> TStack_764;
  BSSRDFSample bssrdfSample;
  SampledSpectrum L;
  PhaseFunctionHandle local_6c0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_6b8;
  Tuple3<pbrt::Vector3,_float> local_6b0;
  Tuple3<pbrt::Point3,_float> local_6a0;
  SampledSpectrum Le;
  SampledSpectrum sigma_maj;
  Vector3<float> local_670;
  float local_664;
  undefined1 local_660;
  SampledSpectrum rrBeta;
  undefined4 uStack_648;
  undefined4 uStack_644;
  undefined4 uStack_640;
  undefined4 uStack_63c;
  undefined4 uStack_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined4 uStack_628;
  undefined4 uStack_624;
  undefined4 uStack_620;
  undefined4 uStack_61c;
  undefined4 local_618;
  undefined4 uStack_614;
  undefined4 local_610;
  undefined8 uStack_60c;
  undefined4 uStack_604;
  undefined4 local_600;
  undefined1 auStack_5fc [60];
  Normal3<float> aNStack_5d8 [10];
  bool local_558;
  SampledSpectrum pdfNEE;
  Ray ray_1;
  undefined1 auStack_510 [24];
  MediumInteraction intr;
  BSDFSample bs;
  SampledSpectrum density;
  Float local_3e0;
  bool local_3dc;
  SampledSpectrum local_3d8;
  BSDF bsdf;
  SampledSpectrum sigma_a;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_328;
  MediumHandle local_320;
  undefined1 local_318 [8];
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_310;
  uintptr_t local_308;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_300;
  LightHandle local_2f8;
  LightHandle local_2f0;
  undefined1 local_2e8 [16];
  optional<pbrt::MediumInteraction> prevMediumIntr;
  optional<pbrt::ShapeIntersection> si;
  optional<pbrt::SurfaceInteraction> prevSurfaceIntr;
  undefined1 extraout_var [60];
  undefined8 uVar248;
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_04 [56];
  
  lVar123 = (ulong)(uint)uStack_638 << 0x20;
  SampledSpectrum::SampledSpectrum(&L,0.0);
  SampledSpectrum::SampledSpectrum(&beta,1.0);
  SampledSpectrum::SampledSpectrum(&pdfUni,1.0);
  SampledSpectrum::SampledSpectrum(&pdfNEE,1.0);
  specularBounce = false;
  bVar107 = false;
  prevSurfaceIntr.set = false;
  depth = 0;
  prevMediumIntr.set = false;
  this_00 = &(ray->super_Ray).d;
  local_2e8 = SUB6416(ZEXT464(0x3f800000),0);
  ray_00 = ray;
  local_898 = ray;
LAB_00431397:
  do {
    auVar145 = ZEXT464(0x7f800000);
    Integrator::Intersect(&si,(Integrator *)this,&ray_00->super_Ray,INFINITY);
    auVar249 = in_ZMM1._8_56_;
    scattered = false;
    terminated = false;
    if (((ray_00->super_Ray).medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         .bits & 0xffffffffffff) != 0) {
      local_8b8._0_4_ = 0x7f800000;
      if (si.set == true) {
        pSVar109 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
        local_8b8._0_4_ = pSVar109->tHit;
      }
      FVar136 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                          ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                            *)sampler);
      uVar110 = Hash<float>(FVar136);
      FVar136 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                          ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                            *)sampler);
      seed = Hash<float>(FVar136);
      RNG::SetSequence((RNG *)&bssrdf,uVar110,seed);
      uVar127 = (local_898->super_Ray).medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                .bits;
      this_02 = (DenselySampledSpectrum *)(uVar127 & 0xffffffffffff);
      bssrdfSample.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y = SUB84(local_898,0);
      bssrdfSample.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.z = (float)((ulong)local_898 >> 0x20);
      bssrdfSample.bsdf._48_8_ = sampler;
      bssrdfSample.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>._0_8_ = this;
      bssrdfSample.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>._4_8_ = lambda;
      if (uVar127 < 0x3000000000000) {
        bssrdfSample.bsdf._0_8_ = &pdfNEE;
        if ((uVar127 & 0x3000000000000) == 0x2000000000000) {
          bssrdfSample._16_8_ = &pdfUni;
          bssrdfSample.S.values.values._8_8_ = &terminated;
          bssrdfSample.S.values.values._0_8_ = &beta;
          bssrdfSample.bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                   )&depth;
          bssrdfSample._96_8_ = &prevSurfaceIntr;
          bssrdfSample.bsdf.shadingFrame._8_8_ = &L;
          bssrdfSample.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &bssrdf;
          bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &prevMediumIntr;
          fVar138 = (local_898->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar130 = ZEXT416((uint)(local_898->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar130 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138)),auVar130,auVar130);
          auVar259 = ZEXT1260(auVar130._4_12_);
          auVar128 = ZEXT416((uint)(local_898->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar130 = vfmadd213ss_fma(auVar128,auVar128,auVar130);
          auVar130 = vsqrtss_avx(auVar130,auVar130);
          local_884 = auVar130._0_4_ * (float)local_8b8._0_4_;
          auVar249 = (undefined1  [56])0x0;
          VVar281 = Normalize<float>(this_00);
          uStack_644 = VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
          in_ZMM1._4_60_ = auVar259;
          in_ZMM1._0_4_ = uStack_644;
          auVar146._0_8_ = VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar146._8_56_ = auVar249;
          rrBeta.values.values[2] = (local_898->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          rrBeta.values.values[0] = (local_898->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          rrBeta.values.values[1] = (local_898->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          uVar248 = vmovlps_avx(auVar146._0_16_);
          rrBeta.values.values[3] = (float)uVar248;
          uStack_648 = (undefined4)((ulong)uVar248 >> 0x20);
          uStack_640 = 0.0;
          uStack_638 = 0.0;
          uStack_634 = 0.0;
          Transform::operator()(&ray_1,(Transform *)(this_02 + 3),(Ray *)&rrBeta,&local_884);
          auVar145 = ZEXT464((uint)local_884);
          bVar106 = Bounds3<float>::IntersectP
                              ((Bounds3<float> *)&this_02->values,&ray_1.o,&ray_1.d,local_884,&tMin,
                               &tMax);
          auVar130 = in_ZMM5._0_16_;
          auVar135 = in_ZmmResult._16_48_;
          auVar249 = in_ZMM1._8_56_;
          if (bVar106) {
            auVar250 = (undefined1  [56])0x0;
            local_8b8._0_4_ = *(Float *)&this_02[2].values.nStored;
            SVar284 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&(this_02->values).nStored,lambda);
            auVar29._8_56_ = auVar249;
            auVar29._0_8_ = SVar284.values.values._8_8_;
            auVar147._0_8_ = SVar284.values.values._0_8_;
            auVar147._8_56_ = auVar250;
            auVar128 = vmovlhps_avx(auVar147._0_16_,auVar29._0_16_);
            rrBeta.values.values._0_8_ = auVar128._0_8_;
            rrBeta.values.values[2] = auVar128._8_4_;
            rrBeta.values.values[3] = auVar128._12_4_;
            auVar250 = (undefined1  [56])0x0;
            SVar284 = SampledSpectrum::operator*(&rrBeta,(Float)local_8b8._0_4_);
            auVar30._8_56_ = auVar249;
            auVar30._0_8_ = SVar284.values.values._8_8_;
            auVar148._0_8_ = SVar284.values.values._0_8_;
            auVar148._8_56_ = auVar250;
            sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar148._0_16_,auVar30._0_16_);
            local_8b8._0_4_ = *(undefined4 *)&this_02[2].values.nStored;
            auVar250 = (undefined1  [56])0x0;
            SVar284 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&this_02[1].values.nStored,lambda);
            auVar31._8_56_ = auVar249;
            auVar31._0_8_ = SVar284.values.values._8_8_;
            auVar149._0_8_ = SVar284.values.values._0_8_;
            auVar149._8_56_ = auVar250;
            auVar128 = vmovlhps_avx(auVar149._0_16_,auVar31._0_16_);
            rrBeta.values.values._0_8_ = auVar128._0_8_;
            rrBeta.values.values[2] = auVar128._8_4_;
            rrBeta.values.values[3] = auVar128._12_4_;
            auVar250 = (undefined1  [56])0x0;
            SVar284 = SampledSpectrum::operator*(&rrBeta,(Float)local_8b8._0_4_);
            auVar32._8_56_ = auVar249;
            auVar32._0_8_ = SVar284.values.values._8_8_;
            auVar150._0_8_ = SVar284.values.values._0_8_;
            auVar150._8_56_ = auVar250;
            bsdf._0_16_ = vmovlhps_avx(auVar150._0_16_,auVar32._0_16_);
            auVar250 = ZEXT856(bsdf.bxdf.
                               super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                               .bits);
            SVar284 = SampledSpectrum::operator+(&sigma_a,(SampledSpectrum *)&bsdf);
            auVar252._8_56_ = auVar249;
            auVar252._0_8_ = SVar284.values.values._8_8_;
            auVar151._0_8_ = SVar284.values.values._0_8_;
            auVar151._8_56_ = auVar250;
            bs.f.values.values = (array<float,_4>)vmovlhps_avx(auVar151._0_16_,auVar252._0_16_);
            auVar249 = ZEXT856(bs.f.values.values._8_8_);
            VVar281 = Bounds3<float>::Diagonal((Bounds3<float> *)&this_02->values);
            auVar145 = _ray_1;
            auVar33._4_60_ = auVar252._4_60_;
            auVar33._0_4_ = VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar152._0_8_ = VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar152._8_56_ = auVar249;
            auVar261._8_8_ = 0;
            auVar261._0_4_ = ray_1.o.super_Tuple3<pbrt::Point3,_float>.y;
            auVar261._4_4_ = ray_1.o.super_Tuple3<pbrt::Point3,_float>.z;
            auVar265._8_8_ = 0;
            auVar265._0_8_ = *(ulong *)((long)&(this_02->values).alloc.memoryResource + 4);
            ray_1.o.super_Tuple3<pbrt::Point3,_float>.x = auVar145._0_4_;
            auVar128 = vsubps_avx(auVar261,auVar265);
            auVar128 = vpermt2ps_avx512vl(auVar128,_DAT_00596440,
                                          ZEXT416((uint)(ray_1.o.super_Tuple3<pbrt::Point3,_float>.x
                                                        - *(float *)&(this_02->values).alloc.
                                                                     memoryResource)));
            ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar145._12_4_;
            auVar128 = vinsertps_avx(auVar128,ZEXT416((uint)ray_1.d.
                                                  super_Tuple3<pbrt::Vector3,_float>.x),0x30);
            auVar129 = vpermt2ps_avx512vl(auVar152._0_16_,_DAT_00596450,auVar33._0_16_);
            ray_1.d.super_Tuple3<pbrt::Vector3,_float>._4_8_ = auVar145._16_8_;
            auVar266._8_8_ = 0;
            auVar266._0_4_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar266._4_4_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar128 = vdivps_avx(auVar128,auVar129);
            auVar129 = vpermt2ps_avx512vl(auVar152._0_16_,ZEXT816(0x400000001),auVar33._0_16_);
            auVar129 = vdivps_avx(auVar266,auVar129);
            sigma_a_3.values.values[0] = auVar128._0_4_;
            sigma_a_3.values.values[1] = auVar128._4_4_;
            sigma_a_3.values.values[2] = auVar128._8_4_;
            sigma_a_3.values.values[3] = auVar128._12_4_;
            uVar248 = vmovlps_avx(auVar129);
            local_7a8 = (float)uVar248;
            fStack_7a4 = (float)((ulong)uVar248 >> 0x20);
            auVar249 = (undefined1  [56])0x0;
            local_7a0 = 0.0;
            local_798.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     )0;
            _ray_1 = auVar145;
            PVar282 = Ray::operator()((Ray *)&sigma_a_3,tMin);
            fVar251 = PVar282.super_Tuple3<pbrt::Point3,_float>.z;
            auVar153._0_8_ = PVar282.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar153._8_56_ = auVar249;
            auVar128 = vpcmpeqd_avx(auVar130,auVar130);
            auVar270 = ZEXT816(0) << 0x40;
            lVar123 = 0;
            iVar121 = *(int *)&this_02[10].values.ptr;
            auVar262._8_8_ = 0;
            auVar262._0_8_ = this_02[10].values.alloc.memoryResource;
            auVar130 = vcvtdq2ps_avx(auVar262);
            auVar128 = vpaddd_avx(auVar262,auVar128);
            auVar128 = vcvtdq2ps_avx(auVar128);
            fVar138 = auVar130._0_4_;
            fVar137 = PVar282.super_Tuple3<pbrt::Point3,_float>.x;
            auVar273._0_4_ = fVar137 * fVar138;
            auVar273._4_4_ = PVar282.super_Tuple3<pbrt::Point3,_float>.y * auVar130._4_4_;
            auVar273._8_4_ = auVar249._0_4_ * auVar130._8_4_;
            auVar273._12_4_ = auVar249._4_4_ * auVar130._12_4_;
            auVar130 = vmovshdup_avx(auVar130);
            fVar271 = 1.0 / fVar138;
            in_ZMM5 = ZEXT464((uint)fVar271);
            auVar129 = vmovshdup_avx(auVar128);
            uVar22 = vcmpps_avx512vl(auVar128,auVar273,1);
            auVar269 = vmovshdup_avx(auVar273);
            uVar248 = vcmpss_avx512f(auVar269,auVar270,1);
            bVar25 = (byte)(uVar22 >> 1);
            fVar260 = (float)iVar121;
            uVar23 = vcmpss_avx512f(auVar273,auVar270,1);
            iVar118 = (int)(float)((uint)!(bool)((byte)uVar248 & 1) *
                                  ((uint)(bVar25 & 1) * auVar129._0_4_ +
                                  (uint)!(bool)(bVar25 & 1) * auVar269._0_4_));
            iVar119 = (int)(float)((uint)!(bool)((byte)uVar23 & 1) *
                                  ((uint)((byte)uVar22 & 1) * auVar128._0_4_ +
                                  (uint)!(bool)((byte)uVar22 & 1) * (int)auVar273._0_4_));
            auVar274._0_4_ = (float)(iVar121 + -1);
            auVar274._4_12_ = in_ZMM12._4_12_;
            fVar272 = auVar130._0_4_;
            auVar130 = vminss_avx(auVar274,ZEXT416((uint)(fVar251 * fVar260)));
            uVar248 = vcmpss_avx512f(ZEXT416((uint)(fVar251 * fVar260)),auVar270,1);
            auVar131._16_48_ = auVar135;
            auVar131._0_16_ = auVar130;
            fVar139 = (float)((uint)!(bool)((byte)uVar248 & 1) * auVar130._0_4_);
            in_ZmmResult._4_60_ = auVar131._4_60_;
            in_ZmmResult._0_4_ = fVar139;
            auVar130 = vmovshdup_avx(auVar153._0_16_);
            iVar121 = (int)fVar139;
            local_8b8._0_4_ = tMin;
            for (; lVar123 != 3; lVar123 = lVar123 + 1) {
              pfVar114 = sigma_a_3.values.values + 3;
              iVar122 = (int)lVar123;
              if ((iVar122 != 0) && (pfVar114 = &local_7a8, iVar122 != 1)) {
                pfVar114 = &fStack_7a4;
              }
              if ((*pfVar114 == 0.0) && (!NAN(*pfVar114))) {
                pfVar114 = sigma_a_3.values.values + 3;
                if ((iVar122 != 0) && (pfVar114 = &local_7a8, iVar122 != 1)) {
                  pfVar114 = &fStack_7a4;
                }
                *pfVar114 = 0.0;
              }
              if (iVar122 == 1) {
                voxel[1] = iVar118;
                piVar124 = voxelLimit + 1;
                piVar125 = step + 1;
                pfVar116 = deltaT + 1;
                pfVar114 = nextCrossingT + 1;
                pfVar115 = &local_7a8;
                iVar117 = iVar118;
              }
              else if (iVar122 == 0) {
                voxel[lVar123] = iVar119;
                piVar124 = voxelLimit;
                piVar125 = step;
                pfVar116 = deltaT;
                pfVar114 = nextCrossingT;
                pfVar115 = sigma_a_3.values.values + 3;
                iVar117 = iVar119;
              }
              else {
                piVar124 = voxelLimit + 2;
                piVar125 = step + 2;
                pfVar116 = deltaT + 2;
                pfVar114 = nextCrossingT + 2;
                pfVar115 = &fStack_7a4;
                voxel[lVar123] = iVar121;
                iVar117 = iVar121;
              }
              if (0.0 <= *pfVar115) {
                pfVar115 = sigma_a_3.values.values + 3;
                pvVar126 = &this_02[10].values;
                fVar139 = fVar138;
                fVar279 = fVar137;
                fVar280 = fVar271;
                if ((iVar122 != 0) &&
                   (pfVar115 = &local_7a8,
                   pvVar126 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                              ((long)&this_02[10].values.alloc.memoryResource + 4),
                   fVar139 = fVar272, fVar279 = auVar130._0_4_, fVar280 = 1.0 / fVar272,
                   iVar122 != 1)) {
                  pfVar115 = &fStack_7a4;
                  pvVar126 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                             &this_02[10].values.ptr;
                  fVar139 = fVar260;
                  fVar279 = fVar251;
                  fVar280 = 1.0 / fVar260;
                }
                *piVar125 = 1;
                auVar128 = vcvtsi2ss_avx512f(in_XMM16,iVar117 + 1);
                fVar1 = *pfVar115;
                *pfVar116 = fVar280 / fVar1;
                *pfVar114 = (auVar128._0_4_ / fVar139 - fVar279) / fVar1 + tMin;
                iVar122 = *(int *)&(pvVar126->alloc).memoryResource;
              }
              else {
                pfVar115 = sigma_a_3.values.values + 3;
                fVar139 = fVar138;
                fVar279 = fVar137;
                fVar280 = -fVar271;
                if ((iVar122 != 0) &&
                   (pfVar115 = &local_7a8, fVar139 = fVar272, fVar279 = auVar130._0_4_,
                   fVar280 = -(1.0 / fVar272), iVar122 != 1)) {
                  pfVar115 = &fStack_7a4;
                  fVar139 = fVar260;
                  fVar279 = fVar251;
                  fVar280 = -(1.0 / fVar260);
                }
                auVar128 = vcvtsi2ss_avx512f(in_XMM16,iVar117);
                *piVar125 = -1;
                fVar1 = *pfVar115;
                *pfVar116 = fVar280 / fVar1;
                *pfVar114 = (auVar128._0_4_ / fVar139 - fVar279) / fVar1 + tMin;
                iVar122 = -1;
              }
              in_ZMM12 = ZEXT464(0);
              *piVar124 = iVar122;
            }
            local_858._0_4_ = RNG::Uniform<float>((RNG *)&bssrdf);
            do {
              auVar249 = (undefined1  [56])0x0;
              iVar121 = *(int *)(&DAT_00596420 +
                                (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                       (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                       (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
              local_8a4 = nextCrossingT[iVar121];
              auVar250 = (undefined1  [56])0x0;
              SVar284 = SampledSpectrum::operator*
                                  (&bs.f,*(Float *)(this_02[9].values.nAlloc +
                                                   (((long)voxel[2] *
                                                     (long)*(int *)((long)&this_02[10].values.alloc.
                                                                           memoryResource + 4) +
                                                    (long)voxel[1]) *
                                                    (long)*(int *)&this_02[10].values.alloc.
                                                                   memoryResource + (long)voxel[0])
                                                   * 4));
              auVar52._8_56_ = auVar249;
              auVar52._0_8_ = SVar284.values.values._8_8_;
              auVar180._0_8_ = SVar284.values.values._0_8_;
              auVar180._8_56_ = auVar250;
              auVar145 = ZEXT1664(auVar180._0_16_);
              sigma_maj.values.values =
                   (array<float,_4>)vmovlhps_avx(auVar180._0_16_,auVar52._0_16_);
              if (SVar284.values.values[0] <= 0.0) {
                in_ZMM1 = ZEXT464((uint)local_858._0_4_);
              }
              else {
                fVar138 = (float)local_8b8._0_4_;
LAB_00432c3c:
                local_8b8._0_4_ = fVar138;
                FVar136 = InvertExponentialSample(local_8a4 - fVar138,auVar145._0_4_);
                if ((float)local_858._0_4_ < FVar136) {
                  in_ZMM1 = ZEXT464((uint)sigma_maj.values.values[0]);
                  FVar136 = SampleExponential((Float)local_858._0_4_,sigma_maj.values.values[0]);
                  auVar128 = in_ZMM12._0_16_;
                  auVar130 = in_ZMM5._0_16_;
                  auVar249 = in_ZMM1._8_56_;
                  fVar138 = FVar136 + (float)local_8b8._0_4_;
                  auVar250 = (undefined1  [56])0x0;
                  if (tMax <= fVar138) {
                    SampledSpectrum::SampledSpectrum((SampledSpectrum *)&intr,1.0);
                    auVar145 = ZEXT1664((undefined1  [16])
                                        intr.super_Interaction.pi.
                                        super_Point3<pbrt::Interval<float>_>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_);
                    aNStack_5d8[2].super_Tuple3<pbrt::Normal3,_float>.x._0_1_ = false;
                    aNStack_5d8[2].super_Tuple3<pbrt::Normal3,_float>.z =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                    aNStack_5d8[3].super_Tuple3<pbrt::Normal3,_float>.x =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                    aNStack_5d8[3].super_Tuple3<pbrt::Normal3,_float>.y =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                    aNStack_5d8[3].super_Tuple3<pbrt::Normal3,_float>.z =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                    Li::anon_class_128_16_8a10e554::operator()
                              ((anon_class_128_16_8a10e554 *)&bssrdfSample,(MediumSample *)&rrBeta);
LAB_004339c7:
                    pstd::optional<pbrt::MediumInteraction>::~optional
                              ((optional<pbrt::MediumInteraction> *)&rrBeta);
                  }
                  else {
                    PVar282 = Ray::operator()(&ray_1,fVar138);
                    local_820.z = PVar282.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar181._0_8_ = PVar282.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    auVar181._8_56_ = auVar250;
                    local_820._0_8_ = vmovlps_avx(auVar181._0_16_);
                    SVar284 = SampledSpectrum::operator-(&sigma_maj);
                    auVar53._8_56_ = auVar249;
                    auVar53._0_8_ = SVar284.values.values._8_8_;
                    auVar182._0_8_ = SVar284.values.values._0_8_;
                    auVar182._8_56_ = auVar250;
                    intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                         vmovlhps_avx(auVar182._0_16_,auVar53._0_16_);
                    auVar250 = (undefined1  [56])0x0;
                    SVar284 = SampledSpectrum::operator*
                                        ((SampledSpectrum *)&intr,fVar138 - (float)local_8b8._0_4_);
                    auVar54._8_56_ = auVar249;
                    auVar54._0_8_ = SVar284.values.values._8_8_;
                    auVar183._0_8_ = SVar284.values.values._0_8_;
                    auVar183._8_56_ = auVar250;
                    auVar129 = vmovlhps_avx(auVar183._0_16_,auVar54._0_16_);
                    auVar250 = ZEXT856(auVar129._8_8_);
                    rrBeta.values.values._0_8_ = auVar129._0_8_;
                    rrBeta.values.values[2] = auVar129._8_4_;
                    rrBeta.values.values[3] = auVar129._12_4_;
                    SVar284 = FastExp(&rrBeta);
                    auVar55._8_56_ = auVar249;
                    auVar55._0_8_ = SVar284.values.values._8_8_;
                    auVar184._0_8_ = SVar284.values.values._0_8_;
                    auVar184._8_56_ = auVar250;
                    local_8b8 = auVar184._0_16_;
                    local_858._0_16_ = auVar55._0_16_;
                    SVar284 = UniformGridMediumProvider::Density
                                        (*(UniformGridMediumProvider **)this_02,
                                         (Point3f *)&local_820,lambda);
                    auVar56._8_56_ = auVar249;
                    auVar56._0_8_ = SVar284.values.values._8_8_;
                    auVar185._0_8_ = SVar284.values.values._0_8_;
                    auVar185._8_56_ = auVar250;
                    density.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar185._0_16_,auVar56._0_16_);
                    auVar250 = ZEXT856(density.values.values._8_8_);
                    SVar284 = UniformGridMediumProvider::Le
                                        (*(UniformGridMediumProvider **)this_02,
                                         (Point3f *)&local_820,lambda);
                    auVar255._8_56_ = auVar249;
                    auVar255._0_8_ = SVar284.values.values._8_8_;
                    auVar186._0_8_ = SVar284.values.values._0_8_;
                    auVar186._8_56_ = auVar250;
                    Le.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar186._0_16_,auVar255._0_16_);
                    auVar249 = ZEXT856(Le.values.values._8_8_);
                    PVar283 = Transform::operator()
                                        ((Transform *)&this_02[6].values,(Point3<float> *)&local_820
                                        );
                    uVar248 = auVar249._0_8_;
                    auVar258 = auVar255._4_12_;
                    local_6a0.z = PVar283.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar187._0_8_ = PVar283.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    auVar187._8_56_ = auVar249;
                    local_6a0._0_8_ = vmovlps_avx(auVar187._0_16_);
                    VVar281 = Normalize<float>(this_00);
                    auVar142._0_8_ =
                         VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    auVar142._8_4_ = (uint)uVar248 ^ 0x80000000;
                    auVar142._12_4_ = (uint)((ulong)uVar248 >> 0x20) ^ 0x80000000;
                    local_6b0.z = -VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar26._8_4_ = auVar258._4_4_ ^ 0x80000000;
                    auVar26._0_8_ =
                         CONCAT44(auVar258._0_4_,VVar281.super_Tuple3<pbrt::Vector3,_float>.z) ^
                         0x8000000080000000;
                    auVar26._12_4_ = auVar258._8_4_ ^ 0x80000000;
                    auVar249 = ZEXT856(auVar26._8_8_);
                    local_6b0._0_8_ = vmovlps_avx(auVar142);
                    local_89c = (local_898->super_Ray).time;
                    auVar250 = (undefined1  [56])0x0;
                    SVar284 = SampledSpectrum::operator*(&sigma_a,&density);
                    auVar57._8_56_ = auVar249;
                    auVar57._0_8_ = SVar284.values.values._8_8_;
                    auVar188._0_8_ = SVar284.values.values._0_8_;
                    auVar188._8_56_ = auVar250;
                    auVar129 = vmovlhps_avx(auVar188._0_16_,auVar57._0_16_);
                    auVar250 = ZEXT856(auVar129._8_8_);
                    rrBeta.values.values._0_8_ = auVar129._0_8_;
                    rrBeta.values.values[2] = auVar129._8_4_;
                    rrBeta.values.values[3] = auVar129._12_4_;
                    SVar284 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,&density);
                    auVar58._8_56_ = auVar249;
                    auVar58._0_8_ = SVar284.values.values._8_8_;
                    auVar189._0_8_ = SVar284.values.values._0_8_;
                    auVar189._8_56_ = auVar250;
                    local_3d8.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar189._0_16_,auVar58._0_16_);
                    local_6c0.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                         (TaggedPointer<pbrt::HGPhaseFunction>)
                         (TaggedPointer<pbrt::HGPhaseFunction>)
                         ((ulong)((long)&this_02[2].values.nStored + 4U) | 0x1000000000000);
                    local_6b8.bits = uVar127;
                    MediumInteraction::MediumInteraction
                              (&intr,(Point3f *)&local_6a0,(Vector3f *)&local_6b0,local_89c,&rrBeta,
                               &local_3d8,&sigma_maj,&Le,(MediumHandle *)&local_6b8,&local_6c0);
                    auVar129 = (undefined1  [16])
                               intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_;
                    aNStack_5d8[2].super_Tuple3<pbrt::Normal3,_float>.x._0_1_ = true;
                    auVar101._8_8_ = intr.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
                    auVar101._0_8_ =
                         intr.super_Interaction.medium.
                         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                         .bits;
                    local_618 = SUB84(intr.super_Interaction.mediumInterface,0);
                    uStack_614 = (undefined4)((ulong)intr.super_Interaction.mediumInterface >> 0x20)
                    ;
                    rrBeta.values.values[0] =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                    rrBeta.values.values[1] =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                    rrBeta.values.values[2] = auVar129._8_4_;
                    rrBeta.values.values[3] = auVar129._12_4_;
                    uStack_648 = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                    uStack_644 = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                    uStack_640 = intr.super_Interaction.time;
                    uStack_638 = intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
                    uStack_634 = intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
                    uStack_630 = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
                    uStack_62c = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
                    uStack_628 = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
                    uStack_624 = intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
                    uStack_620 = intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
                    uStack_61c = intr.super_Interaction._60_4_;
                    in_ZmmResult._8_4_ = intr.sigma_a.values.values[2];
                    in_ZmmResult._12_4_ = intr.sigma_a.values.values[3];
                    in_ZmmResult._0_4_ = intr.sigma_a.values.values[0];
                    in_ZmmResult._4_4_ = intr.sigma_a.values.values[1];
                    in_ZmmResult._16_4_ = intr.sigma_s.values.values[0];
                    in_ZmmResult._20_4_ = intr.sigma_s.values.values[1];
                    in_ZmmResult._24_4_ = intr.sigma_s.values.values[2];
                    in_ZmmResult._28_4_ = intr.sigma_s.values.values[3];
                    in_ZmmResult._32_16_ = (undefined1  [16])intr.sigma_maj.values.values;
                    in_ZmmResult._48_16_ = (undefined1  [16])intr.Le.values.values;
                    local_610 = (undefined4)
                                intr.super_Interaction.medium.
                                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                                .bits;
                    uStack_60c = auVar101._4_8_;
                    uStack_604 = intr.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits._4_4_;
                    local_600 = intr.sigma_a.values.values[0];
                    auStack_5fc = in_ZmmResult._4_60_;
                    aNStack_5d8._32_16_ = vunpcklpd_avx(local_8b8,local_858._0_16_);
                    auVar145 = ZEXT1664(aNStack_5d8._32_16_);
                    in_ZMM1 = ZEXT1664(auVar101);
                    in_ZMM5 = ZEXT1664(auVar130);
                    in_ZMM12 = ZEXT1664(auVar128);
                    intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = auVar129;
                    bVar106 = Li::anon_class_128_16_8a10e554::operator()
                                        ((anon_class_128_16_8a10e554 *)&bssrdfSample,
                                         (MediumSample *)&rrBeta);
                    pstd::optional<pbrt::MediumInteraction>::~optional
                              ((optional<pbrt::MediumInteraction> *)&rrBeta);
                    if (bVar106) goto LAB_00432f11;
                  }
                  break;
                }
                auVar130 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                      ZEXT416((uint)(((float)local_858._0_4_ - FVar136) /
                                                    (1.0 - FVar136))));
                in_ZMM1 = ZEXT1664(auVar130);
              }
              auVar145 = ZEXT464((uint)local_8a4);
              if ((tMax < local_8a4) ||
                 (iVar118 = voxel[iVar121], voxel[iVar121] = iVar118 + step[iVar121],
                 iVar118 + step[iVar121] == voxelLimit[iVar121])) break;
              local_858._0_4_ = in_ZMM1._0_4_;
              local_8b8._0_4_ = local_8a4;
              nextCrossingT[iVar121] = local_8a4 + deltaT[iVar121];
            } while( true );
          }
          goto LAB_004339cf;
        }
        bssrdfSample._16_8_ = &pdfUni;
        bssrdfSample.S.values.values._8_8_ = &terminated;
        bssrdfSample.S.values.values._0_8_ = &beta;
        bssrdfSample.bsdf.bxdf.
        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
        .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                 )&depth;
        bssrdfSample._96_8_ = &prevSurfaceIntr;
        bssrdfSample.bsdf.shadingFrame._8_8_ = &L;
        bssrdfSample.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &bssrdf;
        bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &prevMediumIntr;
        local_858._0_4_ = (local_898->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        local_8a4 = (local_898->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        local_89c = (local_898->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar250 = (undefined1  [56])0x0;
        VVar281 = Normalize<float>(this_00);
        auVar145 = _ray_1;
        auVar162._0_8_ = VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar162._8_56_ = auVar250;
        ray_1.o.super_Tuple3<pbrt::Point3,_float>.z =
             (local_898->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        auVar172 = _ray_1;
        uVar4 = (local_898->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        uVar14 = (local_898->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        ray_1.o.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar14;
        ray_1.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar4;
        stack0xfffffffffffffad0 = auVar172._8_56_;
        uVar248 = vmovlps_avx(auVar162._0_16_);
        ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar248;
        ray_1.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar248 >> 0x20);
        ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z = VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
        stack0xfffffffffffffae4 = auVar145._28_36_;
        ray_1.time = 0.0;
        auVar172 = _ray_1;
        auStack_510 = auVar145._40_24_;
        ray_1._0_32_ = auVar172._0_32_;
        ray_1.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 )0x0;
        FVar136 = (Float)this_02[3].lambda_min;
        auVar250 = (undefined1  [56])0x0;
        SVar284 = DenselySampledSpectrum::Sample(this_02,lambda);
        auVar39._8_56_ = auVar249;
        auVar39._0_8_ = SVar284.values.values._8_8_;
        auVar163._0_8_ = SVar284.values.values._0_8_;
        auVar163._8_56_ = auVar250;
        auVar130 = vmovlhps_avx(auVar163._0_16_,auVar39._0_16_);
        rrBeta.values.values._0_8_ = auVar130._0_8_;
        rrBeta.values.values[2] = auVar130._8_4_;
        rrBeta.values.values[3] = auVar130._12_4_;
        auVar250 = (undefined1  [56])0x0;
        SVar284 = SampledSpectrum::operator*(&rrBeta,FVar136);
        auVar40._8_56_ = auVar249;
        auVar40._0_8_ = SVar284.values.values._8_8_;
        auVar164._0_8_ = SVar284.values.values._0_8_;
        auVar164._8_56_ = auVar250;
        auVar130 = vmovlhps_avx(auVar164._0_16_,auVar40._0_16_);
        sigma_a_3.values.values[0] = auVar130._0_4_;
        sigma_a_3.values.values[1] = auVar130._4_4_;
        sigma_a_3.values.values[2] = auVar130._8_4_;
        sigma_a_3.values.values[3] = auVar130._12_4_;
        FVar136 = (Float)this_02[3].lambda_min;
        auVar250 = (undefined1  [56])0x0;
        SVar284 = DenselySampledSpectrum::Sample(this_02 + 1,lambda);
        auVar41._8_56_ = auVar249;
        auVar41._0_8_ = SVar284.values.values._8_8_;
        auVar165._0_8_ = SVar284.values.values._0_8_;
        auVar165._8_56_ = auVar250;
        auVar130 = vmovlhps_avx(auVar165._0_16_,auVar41._0_16_);
        rrBeta.values.values._0_8_ = auVar130._0_8_;
        rrBeta.values.values[2] = auVar130._8_4_;
        rrBeta.values.values[3] = auVar130._12_4_;
        auVar250 = (undefined1  [56])0x0;
        SVar284 = SampledSpectrum::operator*(&rrBeta,FVar136);
        auVar42._8_56_ = auVar249;
        auVar42._0_8_ = SVar284.values.values._8_8_;
        auVar166._0_8_ = SVar284.values.values._0_8_;
        auVar166._8_56_ = auVar250;
        sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar166._0_16_,auVar42._0_16_);
        auVar250 = ZEXT856(sigma_a.values.values._8_8_);
        SVar284 = SampledSpectrum::operator+(&sigma_a_3,&sigma_a);
        auVar135 = in_ZmmResult._16_48_;
        auVar43._8_56_ = auVar249;
        auVar43._0_8_ = SVar284.values.values._8_8_;
        auVar145._0_8_ = SVar284.values.values._0_8_;
        auVar145._8_56_ = auVar250;
        bsdf._0_16_ = vmovlhps_avx(auVar145._0_16_,auVar43._0_16_);
        in_ZMM1 = ZEXT1664((undefined1  [16])bsdf._0_16_);
        fVar138 = SVar284.values.values[0];
        if ((fVar138 != 0.0) || (NAN(fVar138))) {
          fVar139 = RNG::Uniform<float>((RNG *)&bssrdf);
          auVar167._0_4_ = SampleExponential(fVar139,fVar138);
          auVar129 = in_ZMM12._0_16_;
          auVar128 = in_ZMM5._0_16_;
          auVar167._4_60_ = extraout_var;
          auVar130 = vfmadd213ss_fma(ZEXT416((uint)local_858._0_4_),ZEXT416((uint)local_858._0_4_),
                                     ZEXT416((uint)(local_8a4 * local_8a4)));
          auVar249 = ZEXT856(auVar130._8_8_);
          auVar130 = vfmadd213ss_fma(ZEXT416((uint)local_89c),ZEXT416((uint)local_89c),auVar130);
          auVar130 = vsqrtss_avx(auVar130,auVar130);
          fVar138 = auVar130._0_4_ * (float)local_8b8._0_4_;
          if (fVar138 <= auVar167._0_4_) {
            auVar130._8_4_ = 0x80000000;
            auVar130._0_8_ = 0x8000000080000000;
            auVar130._12_4_ = 0x80000000;
            in_ZmmResult._0_16_ = vxorps_avx512vl(ZEXT416((uint)fVar138),auVar130);
            in_ZmmResult._16_48_ = auVar135;
            auVar250 = ZEXT856(in_ZmmResult._8_8_);
            SVar284 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,in_ZmmResult._0_4_);
            auVar73._8_56_ = auVar249;
            auVar73._0_8_ = SVar284.values.values._8_8_;
            auVar210._0_8_ = SVar284.values.values._0_8_;
            auVar210._8_56_ = auVar250;
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                 vmovlhps_avx(auVar210._0_16_,auVar73._0_16_);
            auVar250 = ZEXT856(intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
            SVar284 = FastExp((SampledSpectrum *)&intr);
            in_ZMM1._8_56_ = auVar249;
            in_ZMM1._0_8_ = SVar284.values.values._8_8_;
            auVar211._0_8_ = SVar284.values.values._0_8_;
            auVar211._8_56_ = auVar250;
            aNStack_5d8._32_16_ = vmovlhps_avx(auVar211._0_16_,in_ZMM1._0_16_);
            auVar145 = ZEXT1664(aNStack_5d8._32_16_);
            aNStack_5d8[2].super_Tuple3<pbrt::Normal3,_float>.x._0_1_ = false;
            Li::anon_class_128_16_8a10e554::operator()
                      ((anon_class_128_16_8a10e554 *)&bssrdfSample,(MediumSample *)&rrBeta);
          }
          else {
            auVar24._8_4_ = 0x80000000;
            auVar24._0_8_ = 0x8000000080000000;
            auVar24._12_4_ = 0x80000000;
            auVar130 = vxorps_avx512vl(auVar167._0_16_,auVar24);
            auVar250 = ZEXT856(auVar130._8_8_);
            local_8b8 = auVar167._0_16_;
            SVar284 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,auVar130._0_4_);
            auVar44._8_56_ = auVar249;
            auVar44._0_8_ = SVar284.values.values._8_8_;
            auVar168._0_8_ = SVar284.values.values._0_8_;
            auVar168._8_56_ = auVar250;
            auVar130 = vmovlhps_avx(auVar168._0_16_,auVar44._0_16_);
            auVar250 = ZEXT856(auVar130._8_8_);
            rrBeta.values.values._0_8_ = auVar130._0_8_;
            rrBeta.values.values[2] = auVar130._8_4_;
            rrBeta.values.values[3] = auVar130._12_4_;
            SVar284 = FastExp(&rrBeta);
            auVar45._8_56_ = auVar249;
            auVar45._0_8_ = SVar284.values.values._8_8_;
            auVar169._0_8_ = SVar284.values.values._0_8_;
            auVar169._8_56_ = auVar250;
            local_858._0_16_ = auVar45._0_16_;
            SVar284 = DenselySampledSpectrum::Sample(this_02 + 2,lambda);
            auVar46._8_56_ = auVar249;
            auVar46._0_8_ = SVar284.values.values._8_8_;
            auVar170._0_8_ = SVar284.values.values._0_8_;
            auVar170._8_56_ = auVar250;
            bs.f.values.values = (array<float,_4>)vmovlhps_avx(auVar170._0_16_,auVar46._0_16_);
            auVar249 = ZEXT856((ulong)local_8b8._8_8_);
            PVar282 = Ray::operator()(&ray_1,local_8b8._0_4_);
            rrBeta.values.values[2] = PVar282.super_Tuple3<pbrt::Point3,_float>.z;
            auVar171._0_8_ = PVar282.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar171._8_56_ = auVar249;
            rrBeta.values.values._0_8_ = vmovlps_avx(auVar171._0_16_);
            auVar141._0_8_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
            auVar141._8_4_ = 0x80000000;
            auVar141._12_4_ = 0x80000000;
            uVar248 = vmovlps_avx(auVar141);
            sigma_maj.values.values[2] = -ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z;
            sigma_maj.values.values[0] = (float)(int)uVar248;
            sigma_maj.values.values[1] = (float)(int)((ulong)uVar248 >> 0x20);
            uVar127 = (ulong)&this_02[3].lambda_max | 0x1000000000000;
            density.values.values[0] = (float)(int)((ulong)this_02 | 0x1000000000000);
            density.values.values[1] = (float)(int)(((ulong)this_02 | 0x1000000000000) >> 0x20);
            Le.values.values[0] = (float)(int)uVar127;
            Le.values.values[1] = (float)(int)(uVar127 >> 0x20);
            MediumInteraction::MediumInteraction
                      (&intr,(Point3f *)&rrBeta,(Vector3f *)&sigma_maj,(local_898->super_Ray).time,
                       &sigma_a_3,&sigma_a,(SampledSpectrum *)&bsdf,&bs.f,(MediumHandle *)&density,
                       (PhaseFunctionHandle *)&Le);
            auVar130 = (undefined1  [16])
                       intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_;
            aNStack_5d8[2].super_Tuple3<pbrt::Normal3,_float>.x._0_1_ = true;
            auVar100._8_8_ = intr.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
            auVar100._0_8_ =
                 intr.super_Interaction.medium.
                 super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 .bits;
            local_618 = SUB84(intr.super_Interaction.mediumInterface,0);
            uStack_614 = (undefined4)((ulong)intr.super_Interaction.mediumInterface >> 0x20);
            rrBeta.values.values[0] =
                 intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
            rrBeta.values.values[1] =
                 intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
            rrBeta.values.values[2] = auVar130._8_4_;
            rrBeta.values.values[3] = auVar130._12_4_;
            uStack_648 = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
            uStack_644 = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
            uStack_640 = intr.super_Interaction.time;
            lVar123 = intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_ << 0x20;
            uStack_634 = intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
            uStack_630 = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
            uStack_62c = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
            uStack_628 = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
            uStack_624 = intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
            uStack_620 = intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
            uStack_61c = intr.super_Interaction._60_4_;
            in_ZmmResult._8_4_ = intr.sigma_a.values.values[2];
            in_ZmmResult._12_4_ = intr.sigma_a.values.values[3];
            in_ZmmResult._0_4_ = intr.sigma_a.values.values[0];
            in_ZmmResult._4_4_ = intr.sigma_a.values.values[1];
            in_ZmmResult._16_4_ = intr.sigma_s.values.values[0];
            in_ZmmResult._20_4_ = intr.sigma_s.values.values[1];
            in_ZmmResult._24_4_ = intr.sigma_s.values.values[2];
            in_ZmmResult._28_4_ = intr.sigma_s.values.values[3];
            in_ZmmResult._32_16_ = (undefined1  [16])intr.sigma_maj.values.values;
            in_ZmmResult._48_16_ = (undefined1  [16])intr.Le.values.values;
            local_610 = (undefined4)
                        intr.super_Interaction.medium.
                        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                        .bits;
            uStack_60c = auVar100._4_8_;
            uStack_604 = intr.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits._4_4_;
            local_600 = intr.sigma_a.values.values[0];
            auStack_5fc = in_ZmmResult._4_60_;
            aNStack_5d8._32_16_ = vunpcklpd_avx(auVar169._0_16_,local_858._0_16_);
            auVar145 = ZEXT1664(aNStack_5d8._32_16_);
            in_ZMM1 = ZEXT1664(auVar100);
            in_ZMM5 = ZEXT1664(auVar128);
            in_ZMM12 = ZEXT1664(auVar129);
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = auVar130;
            Li::anon_class_128_16_8a10e554::operator()
                      ((anon_class_128_16_8a10e554 *)&bssrdfSample,(MediumSample *)&rrBeta);
          }
          pstd::optional<pbrt::MediumInteraction>::~optional
                    ((optional<pbrt::MediumInteraction> *)&rrBeta);
        }
      }
      else {
        bssrdfSample.bsdf._0_8_ = &pdfNEE;
        if ((uVar127 & 0xfffe000000000000) == 0x2000000000000) {
          bssrdfSample._16_8_ = &pdfUni;
          bssrdfSample.S.values.values._8_8_ = &terminated;
          bssrdfSample.S.values.values._0_8_ = &beta;
          bssrdfSample.bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                   )&depth;
          bssrdfSample._96_8_ = &prevSurfaceIntr;
          bssrdfSample.bsdf.shadingFrame._8_8_ = &L;
          bssrdfSample.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &bssrdf;
          bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &prevMediumIntr;
          fVar138 = (local_898->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar130 = ZEXT416((uint)(local_898->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar130 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138)),auVar130,auVar130);
          auVar259 = ZEXT1260(auVar130._4_12_);
          auVar128 = ZEXT416((uint)(local_898->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar130 = vfmadd213ss_fma(auVar128,auVar128,auVar130);
          auVar130 = vsqrtss_avx(auVar130,auVar130);
          local_884 = auVar130._0_4_ * (float)local_8b8._0_4_;
          auVar249 = (undefined1  [56])0x0;
          VVar281 = Normalize<float>(this_00);
          uStack_644 = VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
          in_ZMM1._4_60_ = auVar259;
          in_ZMM1._0_4_ = uStack_644;
          auVar154._0_8_ = VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar154._8_56_ = auVar249;
          rrBeta.values.values[2] = (local_898->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          rrBeta.values.values[0] = (local_898->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          rrBeta.values.values[1] = (local_898->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          uVar248 = vmovlps_avx(auVar154._0_16_);
          rrBeta.values.values[3] = (float)uVar248;
          uStack_648 = (undefined4)((ulong)uVar248 >> 0x20);
          uStack_640 = 0.0;
          uStack_638 = 0.0;
          uStack_634 = 0.0;
          Transform::operator()(&ray_1,(Transform *)(this_02 + 3),(Ray *)&rrBeta,&local_884);
          auVar145 = ZEXT464((uint)local_884);
          bVar106 = Bounds3<float>::IntersectP
                              ((Bounds3<float> *)&this_02->values,&ray_1.o,&ray_1.d,local_884,&tMin,
                               &tMax);
          auVar130 = in_ZMM5._0_16_;
          auVar135 = in_ZmmResult._16_48_;
          auVar249 = in_ZMM1._8_56_;
          if (bVar106) {
            auVar250 = (undefined1  [56])0x0;
            local_8b8._0_4_ = *(Float *)&this_02[2].values.nStored;
            SVar284 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&(this_02->values).nStored,lambda);
            auVar34._8_56_ = auVar249;
            auVar34._0_8_ = SVar284.values.values._8_8_;
            auVar155._0_8_ = SVar284.values.values._0_8_;
            auVar155._8_56_ = auVar250;
            auVar128 = vmovlhps_avx(auVar155._0_16_,auVar34._0_16_);
            rrBeta.values.values._0_8_ = auVar128._0_8_;
            rrBeta.values.values[2] = auVar128._8_4_;
            rrBeta.values.values[3] = auVar128._12_4_;
            auVar250 = (undefined1  [56])0x0;
            SVar284 = SampledSpectrum::operator*(&rrBeta,(Float)local_8b8._0_4_);
            auVar35._8_56_ = auVar249;
            auVar35._0_8_ = SVar284.values.values._8_8_;
            auVar156._0_8_ = SVar284.values.values._0_8_;
            auVar156._8_56_ = auVar250;
            sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar156._0_16_,auVar35._0_16_);
            local_8b8._0_4_ = *(undefined4 *)&this_02[2].values.nStored;
            auVar250 = (undefined1  [56])0x0;
            SVar284 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&this_02[1].values.nStored,lambda);
            auVar36._8_56_ = auVar249;
            auVar36._0_8_ = SVar284.values.values._8_8_;
            auVar157._0_8_ = SVar284.values.values._0_8_;
            auVar157._8_56_ = auVar250;
            auVar128 = vmovlhps_avx(auVar157._0_16_,auVar36._0_16_);
            rrBeta.values.values._0_8_ = auVar128._0_8_;
            rrBeta.values.values[2] = auVar128._8_4_;
            rrBeta.values.values[3] = auVar128._12_4_;
            auVar250 = (undefined1  [56])0x0;
            SVar284 = SampledSpectrum::operator*(&rrBeta,(Float)local_8b8._0_4_);
            auVar37._8_56_ = auVar249;
            auVar37._0_8_ = SVar284.values.values._8_8_;
            auVar158._0_8_ = SVar284.values.values._0_8_;
            auVar158._8_56_ = auVar250;
            bsdf._0_16_ = vmovlhps_avx(auVar158._0_16_,auVar37._0_16_);
            auVar250 = ZEXT856(bsdf.bxdf.
                               super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                               .bits);
            SVar284 = SampledSpectrum::operator+(&sigma_a,(SampledSpectrum *)&bsdf);
            auVar253._8_56_ = auVar249;
            auVar253._0_8_ = SVar284.values.values._8_8_;
            auVar159._0_8_ = SVar284.values.values._0_8_;
            auVar159._8_56_ = auVar250;
            bs.f.values.values = (array<float,_4>)vmovlhps_avx(auVar159._0_16_,auVar253._0_16_);
            auVar249 = ZEXT856(bs.f.values.values._8_8_);
            VVar281 = Bounds3<float>::Diagonal((Bounds3<float> *)&this_02->values);
            auVar145 = _ray_1;
            auVar38._4_60_ = auVar253._4_60_;
            auVar38._0_4_ = VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar160._0_8_ = VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar160._8_56_ = auVar249;
            auVar263._8_8_ = 0;
            auVar263._0_4_ = ray_1.o.super_Tuple3<pbrt::Point3,_float>.y;
            auVar263._4_4_ = ray_1.o.super_Tuple3<pbrt::Point3,_float>.z;
            auVar267._8_8_ = 0;
            auVar267._0_8_ = *(ulong *)((long)&(this_02->values).alloc.memoryResource + 4);
            ray_1.o.super_Tuple3<pbrt::Point3,_float>.x = auVar145._0_4_;
            auVar128 = vsubps_avx(auVar263,auVar267);
            auVar128 = vpermt2ps_avx512vl(auVar128,_DAT_00596440,
                                          ZEXT416((uint)(ray_1.o.super_Tuple3<pbrt::Point3,_float>.x
                                                        - *(float *)&(this_02->values).alloc.
                                                                     memoryResource)));
            ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar145._12_4_;
            auVar128 = vinsertps_avx(auVar128,ZEXT416((uint)ray_1.d.
                                                  super_Tuple3<pbrt::Vector3,_float>.x),0x30);
            auVar129 = vpermt2ps_avx512vl(auVar160._0_16_,_DAT_00596450,auVar38._0_16_);
            ray_1.d.super_Tuple3<pbrt::Vector3,_float>._4_8_ = auVar145._16_8_;
            auVar268._8_8_ = 0;
            auVar268._0_4_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar268._4_4_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar128 = vdivps_avx(auVar128,auVar129);
            auVar129 = vpermt2ps_avx512vl(auVar160._0_16_,ZEXT816(0x400000001),auVar38._0_16_);
            auVar129 = vdivps_avx(auVar268,auVar129);
            sigma_a_3.values.values[0] = auVar128._0_4_;
            sigma_a_3.values.values[1] = auVar128._4_4_;
            sigma_a_3.values.values[2] = auVar128._8_4_;
            sigma_a_3.values.values[3] = auVar128._12_4_;
            uVar248 = vmovlps_avx(auVar129);
            local_7a8 = (float)uVar248;
            fStack_7a4 = (float)((ulong)uVar248 >> 0x20);
            auVar249 = (undefined1  [56])0x0;
            local_7a0 = 0.0;
            local_798.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     )0;
            _ray_1 = auVar145;
            PVar282 = Ray::operator()((Ray *)&sigma_a_3,tMin);
            fVar251 = PVar282.super_Tuple3<pbrt::Point3,_float>.z;
            auVar161._0_8_ = PVar282.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar161._8_56_ = auVar249;
            auVar128 = vpcmpeqd_avx(auVar130,auVar130);
            auVar270 = ZEXT816(0) << 0x40;
            lVar123 = 0;
            iVar121 = *(int *)&this_02[10].values.ptr;
            auVar264._8_8_ = 0;
            auVar264._0_8_ = this_02[10].values.alloc.memoryResource;
            auVar130 = vcvtdq2ps_avx(auVar264);
            auVar128 = vpaddd_avx(auVar264,auVar128);
            auVar128 = vcvtdq2ps_avx(auVar128);
            fVar138 = auVar130._0_4_;
            fVar137 = PVar282.super_Tuple3<pbrt::Point3,_float>.x;
            auVar275._0_4_ = fVar137 * fVar138;
            auVar275._4_4_ = PVar282.super_Tuple3<pbrt::Point3,_float>.y * auVar130._4_4_;
            auVar275._8_4_ = auVar249._0_4_ * auVar130._8_4_;
            auVar275._12_4_ = auVar249._4_4_ * auVar130._12_4_;
            auVar130 = vmovshdup_avx(auVar130);
            fVar271 = 1.0 / fVar138;
            in_ZMM5 = ZEXT464((uint)fVar271);
            auVar129 = vmovshdup_avx(auVar128);
            uVar22 = vcmpps_avx512vl(auVar128,auVar275,1);
            auVar269 = vmovshdup_avx(auVar275);
            uVar248 = vcmpss_avx512f(auVar269,auVar270,1);
            bVar25 = (byte)(uVar22 >> 1);
            fVar260 = (float)iVar121;
            uVar23 = vcmpss_avx512f(auVar275,auVar270,1);
            iVar118 = (int)(float)((uint)!(bool)((byte)uVar248 & 1) *
                                  ((uint)(bVar25 & 1) * auVar129._0_4_ +
                                  (uint)!(bool)(bVar25 & 1) * auVar269._0_4_));
            iVar119 = (int)(float)((uint)!(bool)((byte)uVar23 & 1) *
                                  ((uint)((byte)uVar22 & 1) * auVar128._0_4_ +
                                  (uint)!(bool)((byte)uVar22 & 1) * (int)auVar275._0_4_));
            auVar276._0_4_ = (float)(iVar121 + -1);
            auVar276._4_12_ = in_ZMM12._4_12_;
            fVar272 = auVar130._0_4_;
            auVar130 = vminss_avx(auVar276,ZEXT416((uint)(fVar251 * fVar260)));
            uVar248 = vcmpss_avx512f(ZEXT416((uint)(fVar251 * fVar260)),auVar270,1);
            auVar132._16_48_ = auVar135;
            auVar132._0_16_ = auVar130;
            fVar139 = (float)((uint)!(bool)((byte)uVar248 & 1) * auVar130._0_4_);
            in_ZmmResult._4_60_ = auVar132._4_60_;
            in_ZmmResult._0_4_ = fVar139;
            auVar130 = vmovshdup_avx(auVar161._0_16_);
            iVar121 = (int)fVar139;
            local_8b8._0_4_ = tMin;
            for (; lVar123 != 3; lVar123 = lVar123 + 1) {
              pfVar114 = sigma_a_3.values.values + 3;
              iVar122 = (int)lVar123;
              if ((iVar122 != 0) && (pfVar114 = &local_7a8, iVar122 != 1)) {
                pfVar114 = &fStack_7a4;
              }
              if ((*pfVar114 == 0.0) && (!NAN(*pfVar114))) {
                pfVar114 = sigma_a_3.values.values + 3;
                if ((iVar122 != 0) && (pfVar114 = &local_7a8, iVar122 != 1)) {
                  pfVar114 = &fStack_7a4;
                }
                *pfVar114 = 0.0;
              }
              if (iVar122 == 1) {
                voxel[1] = iVar118;
                piVar124 = voxelLimit + 1;
                piVar125 = step + 1;
                pfVar116 = deltaT + 1;
                pfVar114 = nextCrossingT + 1;
                pfVar115 = &local_7a8;
                iVar117 = iVar118;
              }
              else if (iVar122 == 0) {
                voxel[lVar123] = iVar119;
                piVar124 = voxelLimit;
                piVar125 = step;
                pfVar116 = deltaT;
                pfVar114 = nextCrossingT;
                pfVar115 = sigma_a_3.values.values + 3;
                iVar117 = iVar119;
              }
              else {
                piVar124 = voxelLimit + 2;
                piVar125 = step + 2;
                pfVar116 = deltaT + 2;
                pfVar114 = nextCrossingT + 2;
                pfVar115 = &fStack_7a4;
                voxel[lVar123] = iVar121;
                iVar117 = iVar121;
              }
              if (0.0 <= *pfVar115) {
                pfVar115 = sigma_a_3.values.values + 3;
                pvVar126 = &this_02[10].values;
                fVar139 = fVar138;
                fVar279 = fVar137;
                fVar280 = fVar271;
                if ((iVar122 != 0) &&
                   (pfVar115 = &local_7a8,
                   pvVar126 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                              ((long)&this_02[10].values.alloc.memoryResource + 4),
                   fVar139 = fVar272, fVar279 = auVar130._0_4_, fVar280 = 1.0 / fVar272,
                   iVar122 != 1)) {
                  pfVar115 = &fStack_7a4;
                  pvVar126 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                             &this_02[10].values.ptr;
                  fVar139 = fVar260;
                  fVar279 = fVar251;
                  fVar280 = 1.0 / fVar260;
                }
                *piVar125 = 1;
                auVar128 = vcvtsi2ss_avx512f(in_XMM16,iVar117 + 1);
                fVar1 = *pfVar115;
                *pfVar116 = fVar280 / fVar1;
                *pfVar114 = (auVar128._0_4_ / fVar139 - fVar279) / fVar1 + tMin;
                iVar122 = *(int *)&(pvVar126->alloc).memoryResource;
              }
              else {
                pfVar115 = sigma_a_3.values.values + 3;
                fVar139 = fVar138;
                fVar279 = fVar137;
                fVar280 = -fVar271;
                if ((iVar122 != 0) &&
                   (pfVar115 = &local_7a8, fVar139 = fVar272, fVar279 = auVar130._0_4_,
                   fVar280 = -(1.0 / fVar272), iVar122 != 1)) {
                  pfVar115 = &fStack_7a4;
                  fVar139 = fVar260;
                  fVar279 = fVar251;
                  fVar280 = -(1.0 / fVar260);
                }
                auVar128 = vcvtsi2ss_avx512f(in_XMM16,iVar117);
                *piVar125 = -1;
                fVar1 = *pfVar115;
                *pfVar116 = fVar280 / fVar1;
                *pfVar114 = (auVar128._0_4_ / fVar139 - fVar279) / fVar1 + tMin;
                iVar122 = -1;
              }
              in_ZMM12 = ZEXT464(0);
              *piVar124 = iVar122;
            }
            local_858._0_4_ = RNG::Uniform<float>((RNG *)&bssrdf);
            while( true ) {
              auVar249 = (undefined1  [56])0x0;
              iVar121 = *(int *)(&DAT_00596420 +
                                (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                       (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                       (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
              local_8a4 = nextCrossingT[iVar121];
              auVar250 = (undefined1  [56])0x0;
              SVar284 = SampledSpectrum::operator*
                                  (&bs.f,*(Float *)(this_02[9].values.nAlloc +
                                                   (((long)voxel[2] *
                                                     (long)*(int *)((long)&this_02[10].values.alloc.
                                                                           memoryResource + 4) +
                                                    (long)voxel[1]) *
                                                    (long)*(int *)&this_02[10].values.alloc.
                                                                   memoryResource + (long)voxel[0])
                                                   * 4));
              auVar59._8_56_ = auVar249;
              auVar59._0_8_ = SVar284.values.values._8_8_;
              auVar190._0_8_ = SVar284.values.values._0_8_;
              auVar190._8_56_ = auVar250;
              auVar145 = ZEXT1664(auVar190._0_16_);
              sigma_maj.values.values =
                   (array<float,_4>)vmovlhps_avx(auVar190._0_16_,auVar59._0_16_);
              if (SVar284.values.values[0] <= 0.0) {
                in_ZMM1 = ZEXT464((uint)local_858._0_4_);
              }
              else {
                fVar138 = (float)local_8b8._0_4_;
                while( true ) {
                  local_8b8._0_4_ = fVar138;
                  FVar136 = InvertExponentialSample(local_8a4 - fVar138,auVar145._0_4_);
                  if (FVar136 <= (float)local_858._0_4_) break;
                  in_ZMM1 = ZEXT464((uint)sigma_maj.values.values[0]);
                  FVar136 = SampleExponential((Float)local_858._0_4_,sigma_maj.values.values[0]);
                  auVar128 = in_ZMM12._0_16_;
                  auVar130 = in_ZMM5._0_16_;
                  auVar249 = in_ZMM1._8_56_;
                  fVar138 = FVar136 + (float)local_8b8._0_4_;
                  auVar250 = (undefined1  [56])0x0;
                  if (tMax <= fVar138) {
                    SampledSpectrum::SampledSpectrum((SampledSpectrum *)&intr,1.0);
                    auVar145 = ZEXT1664((undefined1  [16])
                                        intr.super_Interaction.pi.
                                        super_Point3<pbrt::Interval<float>_>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_);
                    aNStack_5d8[2].super_Tuple3<pbrt::Normal3,_float>.x._0_1_ = false;
                    aNStack_5d8[2].super_Tuple3<pbrt::Normal3,_float>.z =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                    aNStack_5d8[3].super_Tuple3<pbrt::Normal3,_float>.x =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                    aNStack_5d8[3].super_Tuple3<pbrt::Normal3,_float>.y =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                    aNStack_5d8[3].super_Tuple3<pbrt::Normal3,_float>.z =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                    Li::anon_class_128_16_8a10e554::operator()
                              ((anon_class_128_16_8a10e554 *)&bssrdfSample,(MediumSample *)&rrBeta);
                    goto LAB_004339c7;
                  }
                  PVar282 = Ray::operator()(&ray_1,fVar138);
                  local_820.z = PVar282.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar191._0_8_ = PVar282.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  auVar191._8_56_ = auVar250;
                  local_820._0_8_ = vmovlps_avx(auVar191._0_16_);
                  SVar284 = SampledSpectrum::operator-(&sigma_maj);
                  auVar60._8_56_ = auVar249;
                  auVar60._0_8_ = SVar284.values.values._8_8_;
                  auVar192._0_8_ = SVar284.values.values._0_8_;
                  auVar192._8_56_ = auVar250;
                  intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                       vmovlhps_avx(auVar192._0_16_,auVar60._0_16_);
                  auVar250 = (undefined1  [56])0x0;
                  SVar284 = SampledSpectrum::operator*
                                      ((SampledSpectrum *)&intr,fVar138 - (float)local_8b8._0_4_);
                  auVar61._8_56_ = auVar249;
                  auVar61._0_8_ = SVar284.values.values._8_8_;
                  auVar193._0_8_ = SVar284.values.values._0_8_;
                  auVar193._8_56_ = auVar250;
                  auVar129 = vmovlhps_avx(auVar193._0_16_,auVar61._0_16_);
                  auVar250 = ZEXT856(auVar129._8_8_);
                  rrBeta.values.values._0_8_ = auVar129._0_8_;
                  rrBeta.values.values[2] = auVar129._8_4_;
                  rrBeta.values.values[3] = auVar129._12_4_;
                  SVar284 = FastExp(&rrBeta);
                  auVar62._8_56_ = auVar249;
                  auVar62._0_8_ = SVar284.values.values._8_8_;
                  auVar194._0_8_ = SVar284.values.values._0_8_;
                  auVar194._8_56_ = auVar250;
                  local_8b8 = auVar194._0_16_;
                  local_858._0_16_ = auVar62._0_16_;
                  SVar284 = CloudMediumProvider::Density
                                      (*(CloudMediumProvider **)this_02,(Point3f *)&local_820,lambda
                                      );
                  auVar63._8_56_ = auVar249;
                  auVar63._0_8_ = SVar284.values.values._8_8_;
                  auVar195._0_8_ = SVar284.values.values._0_8_;
                  auVar195._8_56_ = auVar250;
                  density.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar195._0_16_,auVar63._0_16_);
                  auVar250 = ZEXT856(density.values.values._8_8_);
                  SVar284 = CloudMediumProvider::Le
                                      (*(CloudMediumProvider **)this_02,(Point3f *)&local_820,lambda
                                      );
                  auVar256._8_56_ = auVar249;
                  auVar256._0_8_ = SVar284.values.values._8_8_;
                  auVar196._0_8_ = SVar284.values.values._0_8_;
                  auVar196._8_56_ = auVar250;
                  Le.values.values = (array<float,_4>)vmovlhps_avx(auVar196._0_16_,auVar256._0_16_);
                  auVar249 = ZEXT856(Le.values.values._8_8_);
                  PVar283 = Transform::operator()
                                      ((Transform *)&this_02[6].values,(Point3<float> *)&local_820);
                  uVar248 = auVar249._0_8_;
                  auVar258 = auVar256._4_12_;
                  local_6a0.z = PVar283.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar197._0_8_ = PVar283.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  auVar197._8_56_ = auVar249;
                  local_6a0._0_8_ = vmovlps_avx(auVar197._0_16_);
                  VVar281 = Normalize<float>(this_00);
                  auVar143._0_8_ =
                       VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  auVar143._8_4_ = (uint)uVar248 ^ 0x80000000;
                  auVar143._12_4_ = (uint)((ulong)uVar248 >> 0x20) ^ 0x80000000;
                  local_6b0.z = -VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar27._8_4_ = auVar258._4_4_ ^ 0x80000000;
                  auVar27._0_8_ =
                       CONCAT44(auVar258._0_4_,VVar281.super_Tuple3<pbrt::Vector3,_float>.z) ^
                       0x8000000080000000;
                  auVar27._12_4_ = auVar258._8_4_ ^ 0x80000000;
                  auVar249 = ZEXT856(auVar27._8_8_);
                  local_6b0._0_8_ = vmovlps_avx(auVar143);
                  local_89c = (local_898->super_Ray).time;
                  auVar250 = (undefined1  [56])0x0;
                  SVar284 = SampledSpectrum::operator*(&sigma_a,&density);
                  auVar64._8_56_ = auVar249;
                  auVar64._0_8_ = SVar284.values.values._8_8_;
                  auVar198._0_8_ = SVar284.values.values._0_8_;
                  auVar198._8_56_ = auVar250;
                  auVar129 = vmovlhps_avx(auVar198._0_16_,auVar64._0_16_);
                  auVar250 = ZEXT856(auVar129._8_8_);
                  rrBeta.values.values._0_8_ = auVar129._0_8_;
                  rrBeta.values.values[2] = auVar129._8_4_;
                  rrBeta.values.values[3] = auVar129._12_4_;
                  SVar284 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,&density);
                  auVar65._8_56_ = auVar249;
                  auVar65._0_8_ = SVar284.values.values._8_8_;
                  auVar199._0_8_ = SVar284.values.values._0_8_;
                  auVar199._8_56_ = auVar250;
                  local_3d8.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar199._0_16_,auVar65._0_16_);
                  local_6c0.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       ((ulong)((long)&this_02[2].values.nStored + 4U) | 0x1000000000000);
                  local_6b8.bits = uVar127 | 0x3000000000000;
                  MediumInteraction::MediumInteraction
                            (&intr,(Point3f *)&local_6a0,(Vector3f *)&local_6b0,local_89c,&rrBeta,
                             &local_3d8,&sigma_maj,&Le,(MediumHandle *)&local_6b8,&local_6c0);
                  auVar129 = (undefined1  [16])
                             intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_;
                  aNStack_5d8[2].super_Tuple3<pbrt::Normal3,_float>.x._0_1_ = true;
                  auVar102._8_8_ = intr.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
                  auVar102._0_8_ =
                       intr.super_Interaction.medium.
                       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                       .bits;
                  local_618 = SUB84(intr.super_Interaction.mediumInterface,0);
                  uStack_614 = (undefined4)((ulong)intr.super_Interaction.mediumInterface >> 0x20);
                  rrBeta.values.values[0] =
                       intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                  rrBeta.values.values[1] =
                       intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                  rrBeta.values.values[2] = auVar129._8_4_;
                  rrBeta.values.values[3] = auVar129._12_4_;
                  uStack_648 = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                  uStack_644 = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                  uStack_640 = intr.super_Interaction.time;
                  uStack_638 = intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
                  uStack_634 = intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
                  uStack_630 = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  uStack_62c = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  uStack_628 = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
                  uStack_624 = intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
                  uStack_620 = intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
                  uStack_61c = intr.super_Interaction._60_4_;
                  in_ZmmResult._8_4_ = intr.sigma_a.values.values[2];
                  in_ZmmResult._12_4_ = intr.sigma_a.values.values[3];
                  in_ZmmResult._0_4_ = intr.sigma_a.values.values[0];
                  in_ZmmResult._4_4_ = intr.sigma_a.values.values[1];
                  in_ZmmResult._16_4_ = intr.sigma_s.values.values[0];
                  in_ZmmResult._20_4_ = intr.sigma_s.values.values[1];
                  in_ZmmResult._24_4_ = intr.sigma_s.values.values[2];
                  in_ZmmResult._28_4_ = intr.sigma_s.values.values[3];
                  in_ZmmResult._32_16_ = (undefined1  [16])intr.sigma_maj.values.values;
                  in_ZmmResult._48_16_ = (undefined1  [16])intr.Le.values.values;
                  local_610 = (undefined4)
                              intr.super_Interaction.medium.
                              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                              .bits;
                  uStack_60c = auVar102._4_8_;
                  uStack_604 = intr.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits._4_4_;
                  local_600 = intr.sigma_a.values.values[0];
                  auStack_5fc = in_ZmmResult._4_60_;
                  aNStack_5d8._32_16_ = vunpcklpd_avx(local_8b8,local_858._0_16_);
                  auVar145 = ZEXT1664(aNStack_5d8._32_16_);
                  in_ZMM1 = ZEXT1664(auVar102);
                  in_ZMM5 = ZEXT1664(auVar130);
                  in_ZMM12 = ZEXT1664(auVar128);
                  intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = auVar129;
                  bVar106 = Li::anon_class_128_16_8a10e554::operator()
                                      ((anon_class_128_16_8a10e554 *)&bssrdfSample,
                                       (MediumSample *)&rrBeta);
                  pstd::optional<pbrt::MediumInteraction>::~optional
                            ((optional<pbrt::MediumInteraction> *)&rrBeta);
                  if (!bVar106) goto LAB_004339cf;
                  local_858._0_4_ = RNG::Uniform<float>((RNG *)&bssrdf);
                  local_858._4_12_ = auVar62._4_12_;
                  auVar145 = ZEXT464((uint)sigma_maj.values.values[0]);
                }
                auVar130 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                      ZEXT416((uint)(((float)local_858._0_4_ - FVar136) /
                                                    (1.0 - FVar136))));
                in_ZMM1 = ZEXT1664(auVar130);
              }
              auVar145 = ZEXT464((uint)local_8a4);
              if ((tMax < local_8a4) ||
                 (iVar118 = voxel[iVar121], voxel[iVar121] = iVar118 + step[iVar121],
                 iVar118 + step[iVar121] == voxelLimit[iVar121])) break;
              local_858._0_4_ = in_ZMM1._0_4_;
              local_8b8._0_4_ = local_8a4;
              nextCrossingT[iVar121] = local_8a4 + deltaT[iVar121];
            }
          }
        }
        else {
          bssrdfSample._16_8_ = &pdfUni;
          bssrdfSample.S.values.values._8_8_ = &terminated;
          bssrdfSample.S.values.values._0_8_ = &beta;
          bssrdfSample.bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                   )&depth;
          bssrdfSample._96_8_ = &prevSurfaceIntr;
          bssrdfSample.bsdf.shadingFrame._8_8_ = &L;
          bssrdfSample.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &bssrdf;
          bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &prevMediumIntr;
          fVar138 = (local_898->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar130 = ZEXT416((uint)(local_898->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
          auVar130 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138)),auVar130,auVar130);
          auVar259 = ZEXT1260(auVar130._4_12_);
          auVar128 = ZEXT416((uint)(local_898->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          auVar130 = vfmadd213ss_fma(auVar128,auVar128,auVar130);
          auVar130 = vsqrtss_avx(auVar130,auVar130);
          local_884 = auVar130._0_4_ * (float)local_8b8._0_4_;
          auVar249 = (undefined1  [56])0x0;
          VVar281 = Normalize<float>(this_00);
          uStack_644 = VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
          in_ZMM1._4_60_ = auVar259;
          in_ZMM1._0_4_ = uStack_644;
          auVar172._0_8_ = VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar172._8_56_ = auVar249;
          rrBeta.values.values[2] = (local_898->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          rrBeta.values.values[0] = (local_898->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          rrBeta.values.values[1] = (local_898->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          uVar248 = vmovlps_avx(auVar172._0_16_);
          rrBeta.values.values[3] = (float)uVar248;
          uStack_648 = (undefined4)((ulong)uVar248 >> 0x20);
          uStack_640 = 0.0;
          uStack_638 = 0.0;
          uStack_634 = 0.0;
          Transform::operator()(&ray_1,(Transform *)(this_02 + 3),(Ray *)&rrBeta,&local_884);
          auVar145 = ZEXT464((uint)local_884);
          bVar106 = Bounds3<float>::IntersectP
                              ((Bounds3<float> *)&this_02->values,&ray_1.o,&ray_1.d,local_884,&tMin,
                               &tMax);
          auVar130 = in_ZMM5._0_16_;
          auVar135 = in_ZmmResult._16_48_;
          auVar249 = in_ZMM1._8_56_;
          if (bVar106) {
            auVar250 = (undefined1  [56])0x0;
            local_8b8._0_4_ = *(Float *)&this_02[2].values.nStored;
            SVar284 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&(this_02->values).nStored,lambda);
            auVar47._8_56_ = auVar249;
            auVar47._0_8_ = SVar284.values.values._8_8_;
            auVar173._0_8_ = SVar284.values.values._0_8_;
            auVar173._8_56_ = auVar250;
            auVar128 = vmovlhps_avx(auVar173._0_16_,auVar47._0_16_);
            rrBeta.values.values._0_8_ = auVar128._0_8_;
            rrBeta.values.values[2] = auVar128._8_4_;
            rrBeta.values.values[3] = auVar128._12_4_;
            auVar250 = (undefined1  [56])0x0;
            SVar284 = SampledSpectrum::operator*(&rrBeta,(Float)local_8b8._0_4_);
            auVar48._8_56_ = auVar249;
            auVar48._0_8_ = SVar284.values.values._8_8_;
            auVar174._0_8_ = SVar284.values.values._0_8_;
            auVar174._8_56_ = auVar250;
            sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar174._0_16_,auVar48._0_16_);
            local_8b8._0_4_ = *(undefined4 *)&this_02[2].values.nStored;
            auVar250 = (undefined1  [56])0x0;
            SVar284 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&this_02[1].values.nStored,lambda);
            auVar49._8_56_ = auVar249;
            auVar49._0_8_ = SVar284.values.values._8_8_;
            auVar175._0_8_ = SVar284.values.values._0_8_;
            auVar175._8_56_ = auVar250;
            auVar128 = vmovlhps_avx(auVar175._0_16_,auVar49._0_16_);
            rrBeta.values.values._0_8_ = auVar128._0_8_;
            rrBeta.values.values[2] = auVar128._8_4_;
            rrBeta.values.values[3] = auVar128._12_4_;
            auVar250 = (undefined1  [56])0x0;
            SVar284 = SampledSpectrum::operator*(&rrBeta,(Float)local_8b8._0_4_);
            auVar50._8_56_ = auVar249;
            auVar50._0_8_ = SVar284.values.values._8_8_;
            auVar176._0_8_ = SVar284.values.values._0_8_;
            auVar176._8_56_ = auVar250;
            bsdf._0_16_ = vmovlhps_avx(auVar176._0_16_,auVar50._0_16_);
            auVar250 = ZEXT856(bsdf.bxdf.
                               super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                               .bits);
            SVar284 = SampledSpectrum::operator+(&sigma_a,(SampledSpectrum *)&bsdf);
            auVar254._8_56_ = auVar249;
            auVar254._0_8_ = SVar284.values.values._8_8_;
            auVar177._0_8_ = SVar284.values.values._0_8_;
            auVar177._8_56_ = auVar250;
            bs.f.values.values = (array<float,_4>)vmovlhps_avx(auVar177._0_16_,auVar254._0_16_);
            auVar249 = ZEXT856(bs.f.values.values._8_8_);
            VVar281 = Bounds3<float>::Diagonal((Bounds3<float> *)&this_02->values);
            auVar145 = _ray_1;
            auVar51._4_60_ = auVar254._4_60_;
            auVar51._0_4_ = VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar178._0_8_ = VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar178._8_56_ = auVar249;
            auVar128._8_8_ = 0;
            auVar128._0_4_ = ray_1.o.super_Tuple3<pbrt::Point3,_float>.y;
            auVar128._4_4_ = ray_1.o.super_Tuple3<pbrt::Point3,_float>.z;
            auVar269._8_8_ = 0;
            auVar269._0_8_ = *(ulong *)((long)&(this_02->values).alloc.memoryResource + 4);
            ray_1.o.super_Tuple3<pbrt::Point3,_float>.x = auVar145._0_4_;
            auVar128 = vsubps_avx(auVar128,auVar269);
            auVar128 = vpermt2ps_avx512vl(auVar128,_DAT_00596440,
                                          ZEXT416((uint)(ray_1.o.super_Tuple3<pbrt::Point3,_float>.x
                                                        - *(float *)&(this_02->values).alloc.
                                                                     memoryResource)));
            ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar145._12_4_;
            auVar128 = vinsertps_avx(auVar128,ZEXT416((uint)ray_1.d.
                                                  super_Tuple3<pbrt::Vector3,_float>.x),0x30);
            auVar129 = vpermt2ps_avx512vl(auVar178._0_16_,_DAT_00596450,auVar51._0_16_);
            ray_1.d.super_Tuple3<pbrt::Vector3,_float>._4_8_ = auVar145._16_8_;
            auVar270._8_8_ = 0;
            auVar270._0_4_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar270._4_4_ = ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar128 = vdivps_avx(auVar128,auVar129);
            auVar129 = vpermt2ps_avx512vl(auVar178._0_16_,ZEXT816(0x400000001),auVar51._0_16_);
            auVar129 = vdivps_avx(auVar270,auVar129);
            sigma_a_3.values.values[0] = auVar128._0_4_;
            sigma_a_3.values.values[1] = auVar128._4_4_;
            sigma_a_3.values.values[2] = auVar128._8_4_;
            sigma_a_3.values.values[3] = auVar128._12_4_;
            uVar248 = vmovlps_avx(auVar129);
            local_7a8 = (float)uVar248;
            fStack_7a4 = (float)((ulong)uVar248 >> 0x20);
            auVar249 = (undefined1  [56])0x0;
            local_7a0 = 0.0;
            local_798.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     )0;
            _ray_1 = auVar145;
            PVar282 = Ray::operator()((Ray *)&sigma_a_3,tMin);
            fVar251 = PVar282.super_Tuple3<pbrt::Point3,_float>.z;
            auVar179._0_8_ = PVar282.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar179._8_56_ = auVar249;
            auVar128 = vpcmpeqd_avx(auVar130,auVar130);
            iVar121 = *(int *)&this_02[10].values.ptr;
            auVar270 = ZEXT816(0) << 0x40;
            lVar123 = 0;
            auVar129._8_8_ = 0;
            auVar129._0_8_ = this_02[10].values.alloc.memoryResource;
            auVar130 = vcvtdq2ps_avx(auVar129);
            auVar128 = vpaddd_avx(auVar129,auVar128);
            auVar128 = vcvtdq2ps_avx(auVar128);
            fVar138 = auVar130._0_4_;
            fVar137 = PVar282.super_Tuple3<pbrt::Point3,_float>.x;
            auVar277._0_4_ = fVar137 * fVar138;
            auVar277._4_4_ = PVar282.super_Tuple3<pbrt::Point3,_float>.y * auVar130._4_4_;
            auVar277._8_4_ = auVar249._0_4_ * auVar130._8_4_;
            auVar277._12_4_ = auVar249._4_4_ * auVar130._12_4_;
            auVar130 = vmovshdup_avx(auVar130);
            fVar271 = 1.0 / fVar138;
            in_ZMM5 = ZEXT464((uint)fVar271);
            auVar129 = vmovshdup_avx(auVar128);
            uVar127 = vcmpps_avx512vl(auVar128,auVar277,1);
            auVar269 = vmovshdup_avx(auVar277);
            uVar248 = vcmpss_avx512f(auVar269,auVar270,1);
            bVar25 = (byte)(uVar127 >> 1);
            fVar260 = (float)iVar121;
            uVar23 = vcmpss_avx512f(auVar277,auVar270,1);
            iVar118 = (int)(float)((uint)!(bool)((byte)uVar248 & 1) *
                                  ((uint)(bVar25 & 1) * auVar129._0_4_ +
                                  (uint)!(bool)(bVar25 & 1) * auVar269._0_4_));
            iVar119 = (int)(float)((uint)!(bool)((byte)uVar23 & 1) *
                                  ((uint)((byte)uVar127 & 1) * auVar128._0_4_ +
                                  (uint)!(bool)((byte)uVar127 & 1) * (int)auVar277._0_4_));
            auVar278._0_4_ = (float)(iVar121 + -1);
            auVar278._4_12_ = in_ZMM12._4_12_;
            fVar272 = auVar130._0_4_;
            auVar130 = vminss_avx(auVar278,ZEXT416((uint)(fVar251 * fVar260)));
            uVar248 = vcmpss_avx512f(ZEXT416((uint)(fVar251 * fVar260)),auVar270,1);
            auVar133._16_48_ = auVar135;
            auVar133._0_16_ = auVar130;
            fVar139 = (float)((uint)!(bool)((byte)uVar248 & 1) * auVar130._0_4_);
            in_ZmmResult._4_60_ = auVar133._4_60_;
            in_ZmmResult._0_4_ = fVar139;
            auVar130 = vmovshdup_avx(auVar179._0_16_);
            iVar121 = (int)fVar139;
            local_8b8._0_4_ = tMin;
            for (; lVar123 != 3; lVar123 = lVar123 + 1) {
              pfVar114 = sigma_a_3.values.values + 3;
              iVar122 = (int)lVar123;
              if ((iVar122 != 0) && (pfVar114 = &local_7a8, iVar122 != 1)) {
                pfVar114 = &fStack_7a4;
              }
              if ((*pfVar114 == 0.0) && (!NAN(*pfVar114))) {
                pfVar114 = sigma_a_3.values.values + 3;
                if ((iVar122 != 0) && (pfVar114 = &local_7a8, iVar122 != 1)) {
                  pfVar114 = &fStack_7a4;
                }
                *pfVar114 = 0.0;
              }
              if (iVar122 == 1) {
                voxel[1] = iVar118;
                piVar124 = voxelLimit + 1;
                piVar125 = step + 1;
                pfVar116 = deltaT + 1;
                pfVar114 = nextCrossingT + 1;
                pfVar115 = &local_7a8;
                iVar117 = iVar118;
              }
              else if (iVar122 == 0) {
                voxel[lVar123] = iVar119;
                piVar124 = voxelLimit;
                piVar125 = step;
                pfVar116 = deltaT;
                pfVar114 = nextCrossingT;
                pfVar115 = sigma_a_3.values.values + 3;
                iVar117 = iVar119;
              }
              else {
                piVar124 = voxelLimit + 2;
                piVar125 = step + 2;
                pfVar116 = deltaT + 2;
                pfVar114 = nextCrossingT + 2;
                pfVar115 = &fStack_7a4;
                voxel[lVar123] = iVar121;
                iVar117 = iVar121;
              }
              if (0.0 <= *pfVar115) {
                pfVar115 = sigma_a_3.values.values + 3;
                pvVar126 = &this_02[10].values;
                fVar139 = fVar138;
                fVar279 = fVar137;
                fVar280 = fVar271;
                if ((iVar122 != 0) &&
                   (pfVar115 = &local_7a8,
                   pvVar126 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                              ((long)&this_02[10].values.alloc.memoryResource + 4),
                   fVar139 = fVar272, fVar279 = auVar130._0_4_, fVar280 = 1.0 / fVar272,
                   iVar122 != 1)) {
                  pfVar115 = &fStack_7a4;
                  pvVar126 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                             &this_02[10].values.ptr;
                  fVar139 = fVar260;
                  fVar279 = fVar251;
                  fVar280 = 1.0 / fVar260;
                }
                *piVar125 = 1;
                auVar128 = vcvtsi2ss_avx512f(in_XMM16,iVar117 + 1);
                fVar1 = *pfVar115;
                *pfVar116 = fVar280 / fVar1;
                *pfVar114 = (auVar128._0_4_ / fVar139 - fVar279) / fVar1 + tMin;
                iVar122 = *(int *)&(pvVar126->alloc).memoryResource;
              }
              else {
                pfVar115 = sigma_a_3.values.values + 3;
                fVar139 = fVar138;
                fVar279 = fVar137;
                fVar280 = -fVar271;
                if ((iVar122 != 0) &&
                   (pfVar115 = &local_7a8, fVar139 = fVar272, fVar279 = auVar130._0_4_,
                   fVar280 = -(1.0 / fVar272), iVar122 != 1)) {
                  pfVar115 = &fStack_7a4;
                  fVar139 = fVar260;
                  fVar279 = fVar251;
                  fVar280 = -(1.0 / fVar260);
                }
                auVar128 = vcvtsi2ss_avx512f(in_XMM16,iVar117);
                *piVar125 = -1;
                fVar1 = *pfVar115;
                *pfVar116 = fVar280 / fVar1;
                *pfVar114 = (auVar128._0_4_ / fVar139 - fVar279) / fVar1 + tMin;
                iVar122 = -1;
              }
              in_ZMM12 = ZEXT464(0);
              *piVar124 = iVar122;
            }
            local_858._0_4_ = RNG::Uniform<float>((RNG *)&bssrdf);
            while( true ) {
              auVar249 = (undefined1  [56])0x0;
              iVar121 = *(int *)(&DAT_00596420 +
                                (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                       (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                       (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
              local_8a4 = nextCrossingT[iVar121];
              auVar250 = (undefined1  [56])0x0;
              SVar284 = SampledSpectrum::operator*
                                  (&bs.f,*(Float *)(this_02[9].values.nAlloc +
                                                   (((long)voxel[2] *
                                                     (long)*(int *)((long)&this_02[10].values.alloc.
                                                                           memoryResource + 4) +
                                                    (long)voxel[1]) *
                                                    (long)*(int *)&this_02[10].values.alloc.
                                                                   memoryResource + (long)voxel[0])
                                                   * 4));
              auVar66._8_56_ = auVar249;
              auVar66._0_8_ = SVar284.values.values._8_8_;
              auVar200._0_8_ = SVar284.values.values._0_8_;
              auVar200._8_56_ = auVar250;
              auVar145 = ZEXT1664(auVar200._0_16_);
              sigma_maj.values.values =
                   (array<float,_4>)vmovlhps_avx(auVar200._0_16_,auVar66._0_16_);
              if (SVar284.values.values[0] <= 0.0) {
                in_ZMM1 = ZEXT464((uint)local_858._0_4_);
              }
              else {
                fVar138 = (float)local_8b8._0_4_;
                while( true ) {
                  local_8b8._0_4_ = fVar138;
                  FVar136 = InvertExponentialSample(local_8a4 - fVar138,auVar145._0_4_);
                  if (FVar136 <= (float)local_858._0_4_) break;
                  in_ZMM1 = ZEXT464((uint)sigma_maj.values.values[0]);
                  FVar136 = SampleExponential((Float)local_858._0_4_,sigma_maj.values.values[0]);
                  auVar128 = in_ZMM12._0_16_;
                  auVar130 = in_ZMM5._0_16_;
                  auVar249 = in_ZMM1._8_56_;
                  fVar138 = FVar136 + (float)local_8b8._0_4_;
                  auVar250 = (undefined1  [56])0x0;
                  if (tMax <= fVar138) {
                    SampledSpectrum::SampledSpectrum((SampledSpectrum *)&intr,1.0);
                    auVar145 = ZEXT1664((undefined1  [16])
                                        intr.super_Interaction.pi.
                                        super_Point3<pbrt::Interval<float>_>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_);
                    aNStack_5d8[2].super_Tuple3<pbrt::Normal3,_float>.x._0_1_ = false;
                    aNStack_5d8[2].super_Tuple3<pbrt::Normal3,_float>.z =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                    aNStack_5d8[3].super_Tuple3<pbrt::Normal3,_float>.x =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                    aNStack_5d8[3].super_Tuple3<pbrt::Normal3,_float>.y =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                    aNStack_5d8[3].super_Tuple3<pbrt::Normal3,_float>.z =
                         intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                    Li::anon_class_128_16_8a10e554::operator()
                              ((anon_class_128_16_8a10e554 *)&bssrdfSample,(MediumSample *)&rrBeta);
                    goto LAB_004339c7;
                  }
                  PVar282 = Ray::operator()(&ray_1,fVar138);
                  local_820.z = PVar282.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar201._0_8_ = PVar282.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  auVar201._8_56_ = auVar250;
                  local_820._0_8_ = vmovlps_avx(auVar201._0_16_);
                  SVar284 = SampledSpectrum::operator-(&sigma_maj);
                  auVar67._8_56_ = auVar249;
                  auVar67._0_8_ = SVar284.values.values._8_8_;
                  auVar202._0_8_ = SVar284.values.values._0_8_;
                  auVar202._8_56_ = auVar250;
                  intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                       vmovlhps_avx(auVar202._0_16_,auVar67._0_16_);
                  auVar250 = (undefined1  [56])0x0;
                  SVar284 = SampledSpectrum::operator*
                                      ((SampledSpectrum *)&intr,fVar138 - (float)local_8b8._0_4_);
                  auVar68._8_56_ = auVar249;
                  auVar68._0_8_ = SVar284.values.values._8_8_;
                  auVar203._0_8_ = SVar284.values.values._0_8_;
                  auVar203._8_56_ = auVar250;
                  auVar129 = vmovlhps_avx(auVar203._0_16_,auVar68._0_16_);
                  auVar250 = ZEXT856(auVar129._8_8_);
                  rrBeta.values.values._0_8_ = auVar129._0_8_;
                  rrBeta.values.values[2] = auVar129._8_4_;
                  rrBeta.values.values[3] = auVar129._12_4_;
                  SVar284 = FastExp(&rrBeta);
                  auVar69._8_56_ = auVar249;
                  auVar69._0_8_ = SVar284.values.values._8_8_;
                  auVar204._0_8_ = SVar284.values.values._0_8_;
                  auVar204._8_56_ = auVar250;
                  local_8b8 = auVar204._0_16_;
                  local_858._0_16_ = auVar69._0_16_;
                  SVar284 = NanoVDBMediumProvider::Density
                                      (*(NanoVDBMediumProvider **)this_02,(Point3f *)&local_820,
                                       lambda);
                  auVar70._8_56_ = auVar249;
                  auVar70._0_8_ = SVar284.values.values._8_8_;
                  auVar205._0_8_ = SVar284.values.values._0_8_;
                  auVar205._8_56_ = auVar250;
                  density.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar205._0_16_,auVar70._0_16_);
                  auVar250 = ZEXT856(density.values.values._8_8_);
                  SVar284 = NanoVDBMediumProvider::Le
                                      (*(NanoVDBMediumProvider **)this_02,(Point3f *)&local_820,
                                       lambda);
                  auVar257._8_56_ = auVar249;
                  auVar257._0_8_ = SVar284.values.values._8_8_;
                  auVar206._0_8_ = SVar284.values.values._0_8_;
                  auVar206._8_56_ = auVar250;
                  Le.values.values = (array<float,_4>)vmovlhps_avx(auVar206._0_16_,auVar257._0_16_);
                  auVar249 = ZEXT856(Le.values.values._8_8_);
                  PVar283 = Transform::operator()
                                      ((Transform *)&this_02[6].values,(Point3<float> *)&local_820);
                  uVar248 = auVar249._0_8_;
                  auVar258 = auVar257._4_12_;
                  local_6a0.z = PVar283.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar207._0_8_ = PVar283.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  auVar207._8_56_ = auVar249;
                  local_6a0._0_8_ = vmovlps_avx(auVar207._0_16_);
                  VVar281 = Normalize<float>(this_00);
                  auVar144._0_8_ =
                       VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  auVar144._8_4_ = (uint)uVar248 ^ 0x80000000;
                  auVar144._12_4_ = (uint)((ulong)uVar248 >> 0x20) ^ 0x80000000;
                  local_6b0.z = -VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar28._8_4_ = auVar258._4_4_ ^ 0x80000000;
                  auVar28._0_8_ =
                       CONCAT44(auVar258._0_4_,VVar281.super_Tuple3<pbrt::Vector3,_float>.z) ^
                       0x8000000080000000;
                  auVar28._12_4_ = auVar258._8_4_ ^ 0x80000000;
                  auVar249 = ZEXT856(auVar28._8_8_);
                  local_6b0._0_8_ = vmovlps_avx(auVar144);
                  local_89c = (local_898->super_Ray).time;
                  auVar250 = (undefined1  [56])0x0;
                  SVar284 = SampledSpectrum::operator*(&sigma_a,&density);
                  auVar71._8_56_ = auVar249;
                  auVar71._0_8_ = SVar284.values.values._8_8_;
                  auVar208._0_8_ = SVar284.values.values._0_8_;
                  auVar208._8_56_ = auVar250;
                  auVar129 = vmovlhps_avx(auVar208._0_16_,auVar71._0_16_);
                  auVar250 = ZEXT856(auVar129._8_8_);
                  rrBeta.values.values._0_8_ = auVar129._0_8_;
                  rrBeta.values.values[2] = auVar129._8_4_;
                  rrBeta.values.values[3] = auVar129._12_4_;
                  SVar284 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,&density);
                  auVar72._8_56_ = auVar249;
                  auVar72._0_8_ = SVar284.values.values._8_8_;
                  auVar209._0_8_ = SVar284.values.values._0_8_;
                  auVar209._8_56_ = auVar250;
                  local_3d8.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar209._0_16_,auVar72._0_16_);
                  local_6c0.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       ((ulong)((long)&this_02[2].values.nStored + 4U) | 0x1000000000000);
                  local_6b8.bits = (ulong)this_02 | 0x4000000000000;
                  MediumInteraction::MediumInteraction
                            (&intr,(Point3f *)&local_6a0,(Vector3f *)&local_6b0,local_89c,&rrBeta,
                             &local_3d8,&sigma_maj,&Le,(MediumHandle *)&local_6b8,&local_6c0);
                  auVar129 = (undefined1  [16])
                             intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_;
                  aNStack_5d8[2].super_Tuple3<pbrt::Normal3,_float>.x._0_1_ = true;
                  auVar103._8_8_ = intr.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
                  auVar103._0_8_ =
                       intr.super_Interaction.medium.
                       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                       .bits;
                  local_618 = SUB84(intr.super_Interaction.mediumInterface,0);
                  uStack_614 = (undefined4)((ulong)intr.super_Interaction.mediumInterface >> 0x20);
                  rrBeta.values.values[0] =
                       intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                  rrBeta.values.values[1] =
                       intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                  rrBeta.values.values[2] = auVar129._8_4_;
                  rrBeta.values.values[3] = auVar129._12_4_;
                  uStack_648 = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                  uStack_644 = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                  uStack_640 = intr.super_Interaction.time;
                  uStack_638 = intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
                  uStack_634 = intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
                  uStack_630 = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  uStack_62c = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  uStack_628 = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
                  uStack_624 = intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
                  uStack_620 = intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
                  uStack_61c = intr.super_Interaction._60_4_;
                  in_ZmmResult._8_4_ = intr.sigma_a.values.values[2];
                  in_ZmmResult._12_4_ = intr.sigma_a.values.values[3];
                  in_ZmmResult._0_4_ = intr.sigma_a.values.values[0];
                  in_ZmmResult._4_4_ = intr.sigma_a.values.values[1];
                  in_ZmmResult._16_4_ = intr.sigma_s.values.values[0];
                  in_ZmmResult._20_4_ = intr.sigma_s.values.values[1];
                  in_ZmmResult._24_4_ = intr.sigma_s.values.values[2];
                  in_ZmmResult._28_4_ = intr.sigma_s.values.values[3];
                  in_ZmmResult._32_16_ = (undefined1  [16])intr.sigma_maj.values.values;
                  in_ZmmResult._48_16_ = (undefined1  [16])intr.Le.values.values;
                  local_610 = (undefined4)
                              intr.super_Interaction.medium.
                              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                              .bits;
                  uStack_60c = auVar103._4_8_;
                  uStack_604 = intr.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits._4_4_;
                  local_600 = intr.sigma_a.values.values[0];
                  auStack_5fc = in_ZmmResult._4_60_;
                  aNStack_5d8._32_16_ = vunpcklpd_avx(local_8b8,local_858._0_16_);
                  auVar145 = ZEXT1664(aNStack_5d8._32_16_);
                  in_ZMM1 = ZEXT1664(auVar103);
                  in_ZMM5 = ZEXT1664(auVar130);
                  in_ZMM12 = ZEXT1664(auVar128);
                  intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = auVar129;
                  bVar106 = Li::anon_class_128_16_8a10e554::operator()
                                      ((anon_class_128_16_8a10e554 *)&bssrdfSample,
                                       (MediumSample *)&rrBeta);
                  pstd::optional<pbrt::MediumInteraction>::~optional
                            ((optional<pbrt::MediumInteraction> *)&rrBeta);
                  if (!bVar106) goto LAB_004339cf;
                  local_858._0_4_ = RNG::Uniform<float>((RNG *)&bssrdf);
                  local_858._4_12_ = auVar69._4_12_;
                  auVar145 = ZEXT464((uint)sigma_maj.values.values[0]);
                }
                auVar130 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                      ZEXT416((uint)(((float)local_858._0_4_ - FVar136) /
                                                    (1.0 - FVar136))));
                in_ZMM1 = ZEXT1664(auVar130);
              }
              auVar145 = ZEXT464((uint)local_8a4);
              if ((tMax < local_8a4) ||
                 (iVar118 = voxel[iVar121], voxel[iVar121] = iVar118 + step[iVar121],
                 iVar118 + step[iVar121] == voxelLimit[iVar121])) break;
              local_858._0_4_ = in_ZMM1._0_4_;
              local_8b8._0_4_ = local_8a4;
              nextCrossingT[iVar121] = local_8a4 + deltaT[iVar121];
            }
          }
        }
LAB_004339cf:
        lVar123 = (ulong)(uint)uStack_638 << 0x20;
      }
      ray_00 = local_898;
      if ((terminated & 1U) != 0) goto LAB_00434d0e;
    }
    auVar249 = in_ZMM1._8_56_;
    auVar250 = auVar145._8_56_;
    if (scattered == true) {
LAB_00433eda:
      pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
      goto LAB_00431397;
    }
    *(long *)(in_FS_OFFSET + -0x330) = *(long *)(in_FS_OFFSET + -0x330) + 1;
    if ((0 < depth) && (prevSurfaceIntr.set == prevMediumIntr.set)) {
      LogFatal<char_const(&)[57]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                 ,0x43f,"Check failed: %s",
                 (char (*) [57])"prevSurfaceIntr.has_value() ^ prevMediumIntr.has_value()");
    }
    if (si.set == false) {
      this_01 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                 *)(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                   infiniteLights.
                   super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
                   .super__Vector_impl_data._M_start;
      pTVar13 = *(TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                  **)((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                             infiniteLights.
                             super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                             ._M_impl.super__Vector_impl_data + 8);
      while( true ) {
        auVar249 = in_ZMM1._8_56_;
        auVar250 = auVar145._8_56_;
        if (this_01 == pTVar13) break;
        func_02.lambda = lambda;
        func_02.ray = &ray_00->super_Ray;
        SVar284 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                  ::
                  Dispatch<pbrt::LightHandle::Le(pbrt::Ray_const&,pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                            (this_01,func_02);
        in_ZMM1._8_56_ = auVar249;
        in_ZMM1._0_8_ = SVar284.values.values._8_8_;
        auVar238._0_8_ = SVar284.values.values._0_8_;
        auVar238._8_56_ = auVar250;
        auVar130 = vmovlhps_avx(auVar238._0_16_,in_ZMM1._0_16_);
        auVar145 = ZEXT1664(auVar130);
        auVar258 = auVar130._0_12_;
        ray_1.o.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar258._0_4_;
        ray_1.o.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar258._4_4_;
        ray_1.o.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar258._8_4_;
        ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar130._12_4_;
        bVar107 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)&ray_1);
        auVar249 = in_ZMM1._8_56_;
        auVar250 = auVar145._8_56_;
        if (bVar107) {
          if ((depth == 0) || (specularBounce == true)) {
            SVar284 = SampledSpectrum::operator*(&beta,(SampledSpectrum *)&ray_1);
            auVar93._8_56_ = auVar249;
            auVar93._0_8_ = SVar284.values.values._8_8_;
            auVar239._0_8_ = SVar284.values.values._0_8_;
            auVar239._8_56_ = auVar250;
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                 vmovlhps_avx(auVar239._0_16_,auVar93._0_16_);
            FVar136 = SampledSpectrum::Average(&pdfUni);
            local_8b8._0_4_ = FVar136;
            auVar250 = extraout_var_07;
            SVar284 = SampledWavelengths::PDF(lambda);
            auVar94._8_56_ = auVar249;
            auVar94._0_8_ = SVar284.values.values._8_8_;
            auVar240._0_8_ = SVar284.values.values._0_8_;
            auVar240._8_56_ = auVar250;
            auVar130 = vmovlhps_avx(auVar240._0_16_,auVar94._0_16_);
            sigma_a_3.values.values[0] = auVar130._0_4_;
            sigma_a_3.values.values[1] = auVar130._4_4_;
            sigma_a_3.values.values[2] = auVar130._8_4_;
            sigma_a_3.values.values[3] = auVar130._12_4_;
            auVar250 = (undefined1  [56])0x0;
            SVar284 = SampledSpectrum::operator*(&sigma_a_3,(Float)local_8b8._0_4_);
            auVar95._8_56_ = auVar249;
            auVar95._0_8_ = SVar284.values.values._8_8_;
            auVar241._0_8_ = SVar284.values.values._0_8_;
            auVar241._8_56_ = auVar250;
            bssrdfSample.S.values.values =
                 (array<float,_4>)vmovlhps_avx(auVar241._0_16_,auVar95._0_16_);
            auVar250 = ZEXT856(bssrdfSample.S.values.values._8_8_);
            SVar284 = SafeDiv((SampledSpectrum *)&intr,&bssrdfSample.S);
            in_ZMM1._8_56_ = auVar249;
            in_ZMM1._0_8_ = SVar284.values.values._8_8_;
            auVar242._0_8_ = SVar284.values.values._0_8_;
            auVar242._8_56_ = auVar250;
            auVar130 = vmovlhps_avx(auVar242._0_16_,in_ZMM1._0_16_);
            auVar145 = ZEXT1664(auVar130);
            rrBeta.values.values._0_8_ = auVar130._0_8_;
            rrBeta.values.values[2] = auVar130._8_4_;
            rrBeta.values.values[3] = auVar130._12_4_;
            SampledSpectrum::operator+=(&L,&rrBeta);
          }
          else {
            intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
            intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
            intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
            intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = ZEXT816(0);
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = 0.0;
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = 0.0;
            intr.super_Interaction.time = 0.0;
            intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
            if (prevSurfaceIntr.set == true) {
              pSVar111 = pstd::optional<pbrt::SurfaceInteraction>::value(&prevSurfaceIntr);
              IVar12 = (pSVar111->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
              uStack_648 = IVar12.low;
              uStack_644 = IVar12.high;
              rrBeta.values.values._0_8_ =
                   (pSVar111->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
              IVar12 = (pSVar111->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
              rrBeta.values.values[2] = IVar12.low;
              rrBeta.values.values[3] = IVar12.high;
              uStack_638 = (pSVar111->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
              uVar10 = (pSVar111->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
              uVar20 = (pSVar111->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
              uStack_62c = (pSVar111->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
              uVar11 = (pSVar111->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
              uVar21 = (pSVar111->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
              uStack_640 = uVar10;
              uStack_63c = uVar20;
              uStack_634 = uVar11;
              uStack_630 = uVar21;
            }
            else {
              pMVar112 = pstd::optional<pbrt::MediumInteraction>::value(&prevMediumIntr);
              IVar12 = (pMVar112->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
              uStack_648 = IVar12.low;
              uStack_644 = IVar12.high;
              rrBeta.values.values._0_8_ =
                   (pMVar112->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
              IVar12 = (pMVar112->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
              rrBeta.values.values[2] = IVar12.low;
              rrBeta.values.values[3] = IVar12.high;
              uStack_630 = 0.0;
              uStack_62c = 0.0;
              uStack_640 = 0.0;
              uStack_63c = 0.0;
              uStack_638 = 0.0;
              uStack_634 = 0.0;
            }
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = rrBeta.values.values[3];
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = rrBeta.values.values[2];
            intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_634;
            intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_638;
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = (float)uStack_644;
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = (float)uStack_648;
            intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = (float)uStack_63c;
            intr.super_Interaction.time = (Float)uStack_640;
            intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)uStack_62c;
            intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)uStack_630;
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = rrBeta.values.values[0];
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = rrBeta.values.values[1];
            local_2f0.
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits = *(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                      *)this_01;
            func_03.light = &local_2f0;
            func_03.ctx = (LightSampleContext *)&intr;
            FVar136 = TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                      ::
                      Dispatch<pbrt::LightSamplerHandle::PDF(pbrt::LightSampleContext_const&,pbrt::LightHandle)const::_lambda(auto:1)_1_>
                                ((TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                                  *)&this->lightSampler,func_03);
            auVar130 = (undefined1  [16])
                       intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_;
            rrBeta.values.values[0] =
                 intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
            rrBeta.values.values[1] =
                 intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
            rrBeta.values.values[2] = auVar130._8_4_;
            rrBeta.values.values[3] = auVar130._12_4_;
            uVar2 = (ray_00->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
            uVar3 = (ray_00->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
            sigma_a_3.values.values[2] = (ray_00->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar104._12_4_ = 0;
            auVar104._0_4_ = sigma_a.values.values[1];
            auVar104._4_4_ = sigma_a.values.values[2];
            auVar104._8_4_ = sigma_a.values.values[3];
            sigma_a.values.values = (array<float,_4>)(auVar104 << 0x20);
            bssrdfSample.S.values.values._8_8_ = &sigma_a_3;
            bssrdfSample.S.values.values._0_8_ = (optional<pbrt::ShapeIntersection> *)&rrBeta;
            bssrdfSample._16_8_ = &sigma_a;
            auVar249 = (undefined1  [56])0x0;
            func_00.wi = (Vector3f *)&sigma_a_3;
            func_00.ctx = (LightSampleContext *)&rrBeta;
            func_00.mode = (LightSamplingMode *)bssrdfSample._16_8_;
            sigma_a_3.values.values[0] = (float)uVar2;
            sigma_a_3.values.values[1] = (float)uVar3;
            intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = auVar130;
            local_8b8._0_4_ = FVar136;
            FVar136 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                      ::
                      Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                                (this_01,func_00);
            auVar250 = (undefined1  [56])0x0;
            SampledSpectrum::operator*=(&pdfNEE,FVar136 * (float)local_8b8._0_4_);
            SVar284 = SampledSpectrum::operator*(&beta,(SampledSpectrum *)&ray_1);
            auVar96._8_56_ = auVar249;
            auVar96._0_8_ = SVar284.values.values._8_8_;
            auVar243._0_8_ = SVar284.values.values._0_8_;
            auVar243._8_56_ = auVar250;
            bssrdfSample.S.values.values =
                 (array<float,_4>)vmovlhps_avx(auVar243._0_16_,auVar96._0_16_);
            auVar250 = ZEXT856(bssrdfSample.S.values.values._8_8_);
            SVar284 = SampledSpectrum::operator+(&pdfUni,&pdfNEE);
            auVar97._8_56_ = auVar249;
            auVar97._0_8_ = SVar284.values.values._8_8_;
            auVar244._0_8_ = SVar284.values.values._0_8_;
            auVar244._8_56_ = auVar250;
            sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar244._0_16_,auVar97._0_16_);
            local_8b8._0_4_ = SampledSpectrum::Average(&sigma_a);
            auVar250 = extraout_var_08;
            SVar284 = SampledWavelengths::PDF(lambda);
            auVar98._8_56_ = auVar249;
            auVar98._0_8_ = SVar284.values.values._8_8_;
            auVar245._0_8_ = SVar284.values.values._0_8_;
            auVar245._8_56_ = auVar250;
            bsdf._0_16_ = vmovlhps_avx(auVar245._0_16_,auVar98._0_16_);
            auVar250 = (undefined1  [56])0x0;
            SVar284 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_8b8._0_4_);
            auVar99._8_56_ = auVar249;
            auVar99._0_8_ = SVar284.values.values._8_8_;
            auVar246._0_8_ = SVar284.values.values._0_8_;
            auVar246._8_56_ = auVar250;
            auVar130 = vmovlhps_avx(auVar246._0_16_,auVar99._0_16_);
            auVar250 = ZEXT856(auVar130._8_8_);
            sigma_a_3.values.values[0] = auVar130._0_4_;
            sigma_a_3.values.values[1] = auVar130._4_4_;
            sigma_a_3.values.values[2] = auVar130._8_4_;
            sigma_a_3.values.values[3] = auVar130._12_4_;
            SVar284 = SafeDiv(&bssrdfSample.S,&sigma_a_3);
            in_ZMM1._8_56_ = auVar249;
            in_ZMM1._0_8_ = SVar284.values.values._8_8_;
            auVar247._0_8_ = SVar284.values.values._0_8_;
            auVar247._8_56_ = auVar250;
            auVar130 = vmovlhps_avx(auVar247._0_16_,in_ZMM1._0_16_);
            auVar145 = ZEXT1664(auVar130);
            rrBeta.values.values._0_8_ = auVar130._0_8_;
            rrBeta.values.values[2] = auVar130._8_4_;
            rrBeta.values.values[3] = auVar130._12_4_;
            SampledSpectrum::operator+=(&L,&rrBeta);
          }
        }
        this_01 = this_01 + 8;
      }
LAB_00434d0e:
      pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
      pstd::optional<pbrt::MediumInteraction>::~optional(&prevMediumIntr);
      pstd::optional<pbrt::SurfaceInteraction>::~optional(&prevSurfaceIntr);
      return (SampledSpectrum)L.values;
    }
    pSVar109 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    VVar281 = Tuple3<pbrt::Vector3,_float>::operator-(&this_00->super_Tuple3<pbrt::Vector3,_float>);
    rrBeta.values.values[2] = VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar212._0_8_ = VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar212._8_56_ = auVar250;
    rrBeta.values.values._0_8_ = vmovlps_avx(auVar212._0_16_);
    SVar284 = SurfaceInteraction::Le(&pSVar109->intr,(Vector3f *)&rrBeta,lambda);
    in_ZMM1._8_56_ = auVar249;
    in_ZMM1._0_8_ = SVar284.values.values._8_8_;
    auVar213._0_8_ = SVar284.values.values._0_8_;
    auVar213._8_56_ = auVar250;
    Le.values.values = (array<float,_4>)vmovlhps_avx(auVar213._0_16_,in_ZMM1._0_16_);
    auVar250 = ZEXT856(Le.values.values._8_8_);
    bVar106 = SampledSpectrum::operator_cast_to_bool(&Le);
    auVar249 = in_ZMM1._8_56_;
    if (bVar106) {
      if ((depth == 0) || (specularBounce == true)) {
        SVar284 = SampledSpectrum::operator*(&beta,&Le);
        auVar74._8_56_ = auVar249;
        auVar74._0_8_ = SVar284.values.values._8_8_;
        auVar214._0_8_ = SVar284.values.values._0_8_;
        auVar214._8_56_ = auVar250;
        intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
             vmovlhps_avx(auVar214._0_16_,auVar74._0_16_);
        FVar136 = SampledSpectrum::Average(&pdfUni);
        local_8b8._0_4_ = FVar136;
        auVar250 = extraout_var_00;
        SVar284 = SampledWavelengths::PDF(lambda);
        auVar75._8_56_ = auVar249;
        auVar75._0_8_ = SVar284.values.values._8_8_;
        auVar215._0_8_ = SVar284.values.values._0_8_;
        auVar215._8_56_ = auVar250;
        auVar130 = vmovlhps_avx(auVar215._0_16_,auVar75._0_16_);
        auVar258 = auVar130._0_12_;
        ray_1.o.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar258._0_4_;
        ray_1.o.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar258._4_4_;
        ray_1.o.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar258._8_4_;
        ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar130._12_4_;
        auVar250 = (undefined1  [56])0x0;
        SVar284 = SampledSpectrum::operator*((SampledSpectrum *)&ray_1,(Float)local_8b8._0_4_);
        auVar76._8_56_ = auVar249;
        auVar76._0_8_ = SVar284.values.values._8_8_;
        auVar216._0_8_ = SVar284.values.values._0_8_;
        auVar216._8_56_ = auVar250;
        bssrdfSample.S.values.values = (array<float,_4>)vmovlhps_avx(auVar216._0_16_,auVar76._0_16_)
        ;
        auVar250 = ZEXT856(bssrdfSample.S.values.values._8_8_);
        SVar284 = SafeDiv((SampledSpectrum *)&intr,&bssrdfSample.S);
        in_ZMM1._8_56_ = auVar249;
        in_ZMM1._0_8_ = SVar284.values.values._8_8_;
        auVar217._0_8_ = SVar284.values.values._0_8_;
        auVar217._8_56_ = auVar250;
        auVar130 = auVar217._0_16_;
      }
      else {
        intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
        intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
        intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = ZEXT816(0);
        intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = 0.0;
        intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = 0.0;
        intr.super_Interaction.time = 0.0;
        intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        bsdf._0_8_ = (pSVar109->intr).areaLight.
                     super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                     .bits;
        auVar130 = in_ZMM5._0_16_;
        auVar128 = in_ZMM12._0_16_;
        if (prevSurfaceIntr.set == true) {
          pSVar111 = pstd::optional<pbrt::SurfaceInteraction>::value(&prevSurfaceIntr);
          IVar12 = (pSVar111->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          uStack_648 = IVar12.low;
          uStack_644 = IVar12.high;
          rrBeta.values.values._0_8_ =
               (pSVar111->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          IVar12 = (pSVar111->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          rrBeta.values.values[2] = IVar12.low;
          rrBeta.values.values[3] = IVar12.high;
          uStack_638 = (pSVar111->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
          uVar5 = (pSVar111->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
          uVar15 = (pSVar111->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
          uStack_62c = (pSVar111->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          uVar6 = (pSVar111->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
          uVar16 = (pSVar111->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
          uStack_640 = uVar5;
          uStack_63c = uVar15;
          uStack_634 = uVar6;
          uStack_630 = uVar16;
        }
        else {
          pMVar112 = pstd::optional<pbrt::MediumInteraction>::value(&prevMediumIntr);
          IVar12 = (pMVar112->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          uStack_648 = IVar12.low;
          uStack_644 = IVar12.high;
          rrBeta.values.values._0_8_ =
               (pMVar112->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          IVar12 = (pMVar112->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          rrBeta.values.values[2] = IVar12.low;
          rrBeta.values.values[3] = IVar12.high;
          uStack_630 = 0.0;
          uStack_62c = 0.0;
          uStack_640 = 0.0;
          uStack_63c = 0.0;
          uStack_638 = 0.0;
          uStack_634 = 0.0;
        }
        intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = (float)uStack_644;
        intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = (float)uStack_648;
        intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = rrBeta.values.values[3];
        intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = rrBeta.values.values[2];
        intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_634;
        intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_638;
        intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = (float)uStack_63c;
        intr.super_Interaction.time = (Float)uStack_640;
        intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)uStack_62c;
        intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)uStack_630;
        intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = rrBeta.values.values[0];
        intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = rrBeta.values.values[1];
        local_2f8.
        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                 )(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   )bsdf._0_8_;
        func_01.light = &local_2f8;
        func_01.ctx = (LightSampleContext *)&intr;
        FVar136 = TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                  ::
                  Dispatch<pbrt::LightSamplerHandle::PDF(pbrt::LightSampleContext_const&,pbrt::LightHandle)const::_lambda(auto:1)_1_>
                            ((TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                              *)&this->lightSampler,func_01);
        auVar129 = (undefined1  [16])
                   intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_;
        uStack_634 = intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
        uStack_630 = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
        uStack_62c = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
        rrBeta.values.values[0] =
             intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
        rrBeta.values.values[1] =
             intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
        rrBeta.values.values[2] = auVar129._8_4_;
        rrBeta.values.values[3] = auVar129._12_4_;
        uStack_648 = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
        uStack_644 = intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
        uStack_640 = intr.super_Interaction.time;
        lVar123 = intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_ << 0x20;
        sigma_a_3.values.values[0] = 0.0;
        bssrdfSample.S.values.values._8_8_ = &ray_1;
        bssrdfSample.S.values.values._0_8_ = (optional<pbrt::ShapeIntersection> *)&rrBeta;
        bssrdfSample._16_8_ = &sigma_a_3;
        ray_1.o.super_Tuple3<pbrt::Point3,_float> =
             (Tuple3<pbrt::Point3,_float>)(ray_00->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>;
        auVar249 = (undefined1  [56])0x0;
        in_ZMM5 = ZEXT1664(auVar130);
        in_ZMM12 = ZEXT1664(auVar128);
        func.wi = (Vector3f *)&ray_1;
        func.ctx = (LightSampleContext *)&rrBeta;
        func.mode = (LightSamplingMode *)bssrdfSample._16_8_;
        intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = auVar129;
        local_8b8._0_4_ = FVar136;
        FVar136 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                  ::
                  Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                            ((TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                              *)&bsdf,func);
        auVar250 = (undefined1  [56])0x0;
        SampledSpectrum::operator*=(&pdfNEE,FVar136 * (float)local_8b8._0_4_);
        SVar284 = SampledSpectrum::operator*(&beta,&Le);
        auVar77._8_56_ = auVar249;
        auVar77._0_8_ = SVar284.values.values._8_8_;
        auVar218._0_8_ = SVar284.values.values._0_8_;
        auVar218._8_56_ = auVar250;
        bssrdfSample.S.values.values = (array<float,_4>)vmovlhps_avx(auVar218._0_16_,auVar77._0_16_)
        ;
        auVar250 = ZEXT856(bssrdfSample.S.values.values._8_8_);
        SVar284 = SampledSpectrum::operator+(&pdfUni,&pdfNEE);
        auVar78._8_56_ = auVar249;
        auVar78._0_8_ = SVar284.values.values._8_8_;
        auVar219._0_8_ = SVar284.values.values._0_8_;
        auVar219._8_56_ = auVar250;
        auVar130 = vmovlhps_avx(auVar219._0_16_,auVar78._0_16_);
        sigma_a_3.values.values[0] = auVar130._0_4_;
        sigma_a_3.values.values[1] = auVar130._4_4_;
        sigma_a_3.values.values[2] = auVar130._8_4_;
        sigma_a_3.values.values[3] = auVar130._12_4_;
        local_8b8._0_4_ = SampledSpectrum::Average(&sigma_a_3);
        auVar250 = extraout_var_01;
        SVar284 = SampledWavelengths::PDF(lambda);
        auVar79._8_56_ = auVar249;
        auVar79._0_8_ = SVar284.values.values._8_8_;
        auVar220._0_8_ = SVar284.values.values._0_8_;
        auVar220._8_56_ = auVar250;
        sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar220._0_16_,auVar79._0_16_);
        auVar250 = (undefined1  [56])0x0;
        SVar284 = SampledSpectrum::operator*(&sigma_a,(Float)local_8b8._0_4_);
        auVar80._8_56_ = auVar249;
        auVar80._0_8_ = SVar284.values.values._8_8_;
        auVar221._0_8_ = SVar284.values.values._0_8_;
        auVar221._8_56_ = auVar250;
        auVar130 = vmovlhps_avx(auVar221._0_16_,auVar80._0_16_);
        auVar250 = ZEXT856(auVar130._8_8_);
        auVar258 = auVar130._0_12_;
        ray_1.o.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar258._0_4_;
        ray_1.o.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar258._4_4_;
        ray_1.o.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar258._8_4_;
        ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar130._12_4_;
        SVar284 = SafeDiv(&bssrdfSample.S,(SampledSpectrum *)&ray_1);
        in_ZMM1._8_56_ = auVar249;
        in_ZMM1._0_8_ = SVar284.values.values._8_8_;
        auVar222._0_8_ = SVar284.values.values._0_8_;
        auVar222._8_56_ = auVar250;
        auVar130 = auVar222._0_16_;
      }
      auVar130 = vmovlhps_avx(auVar130,in_ZMM1._0_16_);
      auVar250 = ZEXT856(auVar130._8_8_);
      rrBeta.values.values._0_8_ = auVar130._0_8_;
      rrBeta.values.values[2] = auVar130._8_4_;
      rrBeta.values.values[3] = auVar130._12_4_;
      SampledSpectrum::operator+=(&L,&rrBeta);
    }
    uStack_638 = (undefined4)((ulong)lVar123 >> 0x20);
    local_300.bits =
         (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_308 = (sampler->
                super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
    SurfaceInteraction::GetBSDF
              (&bsdf,&pSVar109->intr,ray_00,lambda,(CameraHandle *)&local_300,scratchBuffer,
               (SamplerHandle)&local_308);
    auVar135 = in_ZmmResult._16_48_;
    auVar128 = in_ZMM12._0_16_;
    auVar130 = in_ZMM5._0_16_;
    auVar249 = in_ZMM1._12_56_;
    if (((undefined1  [16])bsdf._0_16_ & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0)
    {
      pSVar113 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      SurfaceInteraction::SkipIntersection(&pSVar109->intr,ray_00,pSVar113->tHit);
      goto LAB_00433eda;
    }
    pstd::optional<pbrt::SurfaceInteraction>::operator=(&prevSurfaceIntr,&pSVar109->intr);
    pstd::optional<pbrt::MediumInteraction>::reset(&prevMediumIntr);
    iVar121 = depth + 1;
    bVar106 = this->maxDepth <= depth;
    depth = iVar121;
    if (bVar106) goto LAB_00434d0e;
    if ((this->regularize == true) && (bVar107)) {
      *(long *)(in_FS_OFFSET + -0x370) = *(long *)(in_FS_OFFSET + -0x370) + 1;
      TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::BSSRDFAdapter>
      ::Dispatch<pbrt::BxDFHandle::Regularize()::_lambda(auto:1)_1_>
                ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::BSSRDFAdapter>
                  *)&bsdf.bxdf);
    }
    *(long *)(in_FS_OFFSET + -0x368) = *(long *)(in_FS_OFFSET + -0x368) + 1;
    bVar106 = BSDF::IsNonSpecular(&bsdf);
    if (bVar106) {
      local_310.bits =
           (sampler->
           super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
      SVar284 = SampleLd(this,(Interaction *)pSVar109,&bsdf,lambda,(SamplerHandle *)&local_310,&beta
                         ,&pdfUni);
      auVar81._8_56_ = auVar249;
      auVar81._0_8_ = SVar284.values.values._8_8_;
      auVar223._0_8_ = SVar284.values.values._0_8_;
      auVar223._8_56_ = auVar250;
      intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
           vmovlhps_avx(auVar223._0_16_,auVar81._0_16_);
      auVar250 = ZEXT856(intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
      SVar284 = SampledWavelengths::PDF(lambda);
      auVar82._8_56_ = auVar249;
      auVar82._0_8_ = SVar284.values.values._8_8_;
      auVar224._0_8_ = SVar284.values.values._0_8_;
      auVar224._8_56_ = auVar250;
      bssrdfSample.S.values.values = (array<float,_4>)vmovlhps_avx(auVar224._0_16_,auVar82._0_16_);
      auVar250 = ZEXT856(bssrdfSample.S.values.values._8_8_);
      SVar284 = SafeDiv((SampledSpectrum *)&intr,&bssrdfSample.S);
      auVar83._8_56_ = auVar249;
      auVar83._0_8_ = SVar284.values.values._8_8_;
      auVar225._0_8_ = SVar284.values.values._0_8_;
      auVar225._8_56_ = auVar250;
      auVar129 = vmovlhps_avx(auVar225._0_16_,auVar83._0_16_);
      auVar250 = ZEXT856(auVar129._8_8_);
      rrBeta.values.values._0_8_ = auVar129._0_8_;
      rrBeta.values.values[2] = auVar129._8_4_;
      rrBeta.values.values[3] = auVar129._12_4_;
      SampledSpectrum::operator+=(&L,&rrBeta);
    }
    VVar281 = Tuple3<pbrt::Vector3,_float>::operator-(&this_00->super_Tuple3<pbrt::Vector3,_float>);
    woRender.super_Tuple3<pbrt::Vector3,_float>.z = VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar226._0_8_ = VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar226._8_56_ = auVar250;
    local_8b8 = auVar226._0_16_;
    FVar136 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
              ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                        ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                          *)sampler);
    local_858._0_4_ = FVar136;
    auVar227._0_8_ =
         TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
         ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                   ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                     *)sampler);
    auVar129 = local_8b8;
    auVar227._8_56_ = extraout_var_02;
    rrBeta.values.values._0_8_ = vmovlps_avx(auVar227._0_16_);
    woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_8b8._0_4_;
    woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_8b8._4_4_;
    auVar249 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
    local_8b8 = auVar129;
    BSDF::Sample_f(&bs,&bsdf,woRender,FVar136,(Point2f *)&rrBeta,Radiance,All);
    if (bs.pdf <= 0.0) goto LAB_00434d0e;
    tVar140 = AbsDot<float>(&bs.wi,&(pSVar109->intr).shading.n);
    auVar250 = extraout_var_03;
    SVar284 = SampledSpectrum::operator*(&bs.f,tVar140);
    auVar84._8_56_ = auVar249;
    auVar84._0_8_ = SVar284.values.values._8_8_;
    auVar228._0_8_ = SVar284.values.values._0_8_;
    auVar228._8_56_ = auVar250;
    auVar129 = vmovlhps_avx(auVar228._0_16_,auVar84._0_16_);
    rrBeta.values.values._0_8_ = auVar129._0_8_;
    rrBeta.values.values[2] = auVar129._8_4_;
    rrBeta.values.values[3] = auVar129._12_4_;
    SampledSpectrum::operator*=(&beta,&rrBeta);
    auVar129 = local_8b8;
    pdfNEE.values.values[0] = pdfUni.values.values[0];
    pdfNEE.values.values[1] = pdfUni.values.values[1];
    pdfNEE.values.values[2] = pdfUni.values.values[2];
    pdfNEE.values.values[3] = pdfUni.values.values[3];
    FVar136 = bs.pdf;
    if (bsdf.bxdf.
        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
        .bits._6_2_ - 3 < 2) {
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = bs.wi.super_Tuple3<pbrt::Vector3,_float>.z;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.x = bs.wi.super_Tuple3<pbrt::Vector3,_float>.x;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.y = bs.wi.super_Tuple3<pbrt::Vector3,_float>.y;
      woRender_00.super_Tuple3<pbrt::Vector3,_float>.z =
           woRender.super_Tuple3<pbrt::Vector3,_float>.z;
      woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_8b8._0_4_;
      woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_8b8._4_4_;
      local_8b8 = auVar129;
      FVar136 = BSDF::PDF(&bsdf,woRender_00,wiRender,Radiance,All);
      local_8b8._0_4_ = FVar136;
      SampledSpectrum::operator*=(&beta,FVar136 / bs.pdf);
      FVar136 = (Float)local_8b8._0_4_;
    }
    SampledSpectrum::operator*=(&pdfUni,FVar136);
    rescale(&beta,&pdfUni,&pdfNEE);
    bVar107 = (bool)(bVar107 | (bs.flags & Specular) == Unset);
    bVar106 = (bs.flags & Transmission) == Unset;
    specularBounce = SUB41((bs.flags & Specular) >> 4,0);
    local_8b8._0_4_ = bsdf.eta;
    SurfaceInteraction::SpawnRay
              ((RayDifferential *)&rrBeta,&pSVar109->intr,ray_00,&bsdf,&bs.wi,bs.flags);
    (ray_00->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = rrBeta.values.values[3];
    (ray_00->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_648;
    *(ulong *)&(ray_00->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
         CONCAT44(uStack_640,uStack_644);
    (ray_00->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = rrBeta.values.values[0];
    (ray_00->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = rrBeta.values.values[1];
    *(ulong *)&(ray_00->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
         CONCAT44(rrBeta.values.values[3],rrBeta.values.values[2]);
    (ray_00->super_Ray).medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = CONCAT44(uStack_634,uStack_638);
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)uStack_61c;
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = (float)local_618;
    (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)uStack_614;
    (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y = (float)local_610;
    *(undefined8 *)&(ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = uStack_60c;
    (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_604;
    (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = (float)local_600;
    ray->hasDifferentials = (bool)(char)uStack_630;
    *(int3 *)&ray->field_0x29 = (int3)((uint)uStack_630 >> 8);
    (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_62c;
    (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)uStack_628;
    (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_624;
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_620;
    (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)uStack_61c;
    *(ulong *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = CONCAT44(uStack_614,local_618);
    local_318 = (undefined1  [8])
                (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                .bits;
    auVar145 = ZEXT1664(auVar130);
    auVar172 = ZEXT1664(auVar128);
    SurfaceInteraction::GetBSSRDF
              ((SurfaceInteraction *)&bssrdf,(RayDifferential *)pSVar109,
               (SampledWavelengths *)ray_00,(CameraHandle *)lambda,(ScratchBuffer *)local_318);
    auVar128 = auVar172._0_16_;
    auVar130 = auVar145._0_16_;
    if ((((ulong)bssrdf.super_TaggedPointer<pbrt::TabulatedBSSRDF>.bits & 0xffffffffffff) != 0) &&
       ((bs.flags & Transmission) != Unset)) {
      FVar136 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                          ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                            *)sampler);
      rrBeta.values.values._0_8_ =
           TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
      BSSRDFHandle::Sample((BSSRDFProbeSegment *)&density,&bssrdf,FVar136,(Point2f *)&rrBeta);
      if (local_3dc == false) goto LAB_00434d0e;
      pSVar120 = sampler;
      FVar136 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                          ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                            *)sampler);
      uVar110 = MixBits(CONCAT44((int)((ulong)pSVar120 >> 0x20),FVar136));
      WeightedReservoirSampler<pbrt::SubsurfaceInteraction>::WeightedReservoirSampler
                ((WeightedReservoirSampler<pbrt::SubsurfaceInteraction> *)&intr,uVar110);
      local_320.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      Interaction::Interaction((Interaction *)&sigma_a,(Point3f *)&density,local_3e0,&local_320);
      while( true ) {
        auVar128 = auVar172._0_16_;
        auVar130 = auVar145._0_16_;
        Interaction::SpawnRayTo
                  (&ray_1,(Interaction *)&sigma_a,(Point3f *)(density.values.values + 3));
        if ((ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x == 0.0) &&
           (ray_1.d.super_Tuple3<pbrt::Vector3,_float>.y == 0.0)) {
          if ((ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z == 0.0) &&
             (!NAN(ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z))) goto LAB_004344b1;
        }
        Integrator::Intersect
                  ((optional<pbrt::ShapeIntersection> *)&rrBeta,(Integrator *)this,&ray_1,1.0);
        if (local_558 == false) break;
        pSVar113 = pstd::optional<pbrt::ShapeIntersection>::value
                             ((optional<pbrt::ShapeIntersection> *)&rrBeta);
        pIVar105 = &(pSVar113->intr).super_Interaction;
        sigma_a.values.values[0] =
             (pIVar105->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
        sigma_a.values.values[1] =
             (pIVar105->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
        sigma_a.values.values[2] =
             (pIVar105->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
        sigma_a.values.values[3] =
             (pIVar105->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
        auVar145 = ZEXT1664(auVar130);
        auVar172 = ZEXT1664(auVar128);
        pSVar113 = pstd::optional<pbrt::ShapeIntersection>::value
                             ((optional<pbrt::ShapeIntersection> *)&rrBeta);
        if ((pSVar113->intr).material.
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits == (pSVar109->intr).material.
                     super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                     .bits) {
          pSVar113 = pstd::optional<pbrt::ShapeIntersection>::value
                               ((optional<pbrt::ShapeIntersection> *)&rrBeta);
          bssrdfSample._16_8_ =
               (pSVar113->intr).super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          pIVar105 = &(pSVar113->intr).super_Interaction;
          bssrdfSample.S.values.values[0] =
               (pIVar105->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
          bssrdfSample.S.values.values[1] =
               (pIVar105->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
          bssrdfSample.S.values.values[2] =
               (pIVar105->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
          bssrdfSample.S.values.values[3] =
               (pIVar105->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
          bssrdfSample.bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._0_4_ = (pSVar113->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
          bssrdfSample.bsdf.eta =
               (pSVar113->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
          bssrdfSample.bsdf._4_4_ =
               (pSVar113->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
          bssrdfSample.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y =
               (pSVar113->intr).dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
          uVar7 = (pSVar113->intr).dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar17 = (pSVar113->intr).dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
          bssrdfSample.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
               (pSVar113->intr).dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
          bssrdfSample.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z =
               (pSVar113->intr).dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
          bssrdfSample.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x =
               (pSVar113->intr).dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
          bssrdfSample.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y =
               (pSVar113->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
          uVar8 = (pSVar113->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.x;
          uVar18 = (pSVar113->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
          bssrdfSample.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y =
               (pSVar113->intr).shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
          bssrdfSample.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z =
               (pSVar113->intr).shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
          bssrdfSample.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x =
               (pSVar113->intr).shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
          bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.y =
               (pSVar113->intr).shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
          uVar9 = (pSVar113->intr).shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar19 = (pSVar113->intr).shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
          bssrdfSample.bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits._4_4_ = uVar7;
          bssrdfSample.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar17;
          bssrdfSample.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = (float)uVar8;
          bssrdfSample.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar18;
          bssrdfSample.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.z = (float)uVar9;
          bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar19;
          WeightedReservoirSampler<pbrt::SubsurfaceInteraction>::Add
                    ((WeightedReservoirSampler<pbrt::SubsurfaceInteraction> *)&intr,
                     (SubsurfaceInteraction *)&bssrdfSample,1.0);
        }
        pstd::optional<pbrt::ShapeIntersection>::~optional
                  ((optional<pbrt::ShapeIntersection> *)&rrBeta);
      }
      pstd::optional<pbrt::ShapeIntersection>::~optional
                ((optional<pbrt::ShapeIntersection> *)&rrBeta);
LAB_004344b1:
      if (intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low <= 0.0) goto LAB_00434d0e;
      ray_1.o.super_Tuple3<pbrt::Point3,_float>.z =
           intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
      ray_1.d.super_Tuple3<pbrt::Vector3,_float>.x =
           intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
      ray_1.o.super_Tuple3<pbrt::Point3,_float>.x = intr.super_Interaction.time;
      ray_1.o.super_Tuple3<pbrt::Point3,_float>.y =
           intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
      ray_1.d.super_Tuple3<pbrt::Vector3,_float>.y =
           intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
      ray_1.d.super_Tuple3<pbrt::Vector3,_float>.z =
           intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
      ray_1.time = intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
      ray_1._28_4_ = intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
      ray_1.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 )intr.super_Interaction._56_8_;
      unique0x10005d43 = intr.super_Interaction.mediumInterface;
      unique0x10005d4b =
           intr.super_Interaction.medium.
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           .bits;
      unique0x10005d53 = intr.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
      auVar135 = ray_1._16_48_;
      auVar249 = ZEXT856(intr.super_Interaction.mediumInterface);
      func_04.si = (SubsurfaceInteraction *)&ray_1;
      func_04.scratchBuffer = scratchBuffer;
      TaggedPointer<pbrt::TabulatedBSSRDF>::
      Dispatch<pbrt::BSSRDFHandle::ProbeIntersectionToSample(pbrt::SubsurfaceInteraction_const&,pbrt::ScratchBuffer&)const::_lambda(auto:1)_1_>
                (&bssrdfSample,&bssrdf.super_TaggedPointer<pbrt::TabulatedBSSRDF>,func_04);
      bVar107 = SampledSpectrum::operator_cast_to_bool(&bssrdfSample.S);
      if (!bVar107) goto LAB_00434d0e;
      if ((bssrdfSample.pdf == 0.0) && (!NAN(bssrdfSample.pdf))) goto LAB_00434d0e;
      auVar250 = (undefined1  [56])0x0;
      SVar284 = SampledSpectrum::operator*
                          (&bssrdfSample.S,
                           intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low);
      auVar85._8_56_ = auVar249;
      auVar85._0_8_ = SVar284.values.values._8_8_;
      auVar229._0_8_ = SVar284.values.values._0_8_;
      auVar229._8_56_ = auVar250;
      auVar129 = vmovlhps_avx(auVar229._0_16_,auVar85._0_16_);
      sigma_a_3.values.values[0] = auVar129._0_4_;
      sigma_a_3.values.values[1] = auVar129._4_4_;
      sigma_a_3.values.values[2] = auVar129._8_4_;
      sigma_a_3.values.values[3] = auVar129._12_4_;
      auVar250 = (undefined1  [56])0x0;
      SVar284 = SampledSpectrum::operator/(&sigma_a_3,bssrdfSample.pdf);
      auVar86._8_56_ = auVar249;
      auVar86._0_8_ = SVar284.values.values._8_8_;
      auVar230._0_8_ = SVar284.values.values._0_8_;
      auVar230._8_56_ = auVar250;
      auVar129 = vmovlhps_avx(auVar230._0_16_,auVar86._0_16_);
      auVar250 = ZEXT856(auVar129._8_8_);
      rrBeta.values.values._0_8_ = auVar129._0_8_;
      rrBeta.values.values[2] = auVar129._8_4_;
      rrBeta.values.values[3] = auVar129._12_4_;
      SampledSpectrum::operator*=(&beta,&rrBeta);
      SubsurfaceInteraction::operator_cast_to_SurfaceInteraction((SubsurfaceInteraction *)&ray_1);
      lVar123 = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      bVar107 = true;
      fVar138 = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.z;
      uStack_634 = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.z;
      if (this->regularize == true) {
        *(long *)(in_FS_OFFSET + -0x370) = *(long *)(in_FS_OFFSET + -0x370) + 1;
        TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::BSSRDFAdapter>
        ::Dispatch<pbrt::BxDFHandle::Regularize()::_lambda(auto:1)_1_>
                  ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::BSSRDFAdapter>
                    *)&bssrdfSample.bsdf.bxdf);
      }
      else {
        *(long *)(in_FS_OFFSET + -0x368) = *(long *)(in_FS_OFFSET + -0x368) + 1;
      }
      pstd::optional<pbrt::SurfaceInteraction>::operator=
                (&prevSurfaceIntr,(SurfaceInteraction *)&rrBeta);
      if (prevMediumIntr.set == true) {
        LogFatal<char_const(&)[28]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                   ,0x4d8,"Check failed: %s",(char (*) [28])"!prevMediumIntr.has_value()");
      }
      local_328.bits =
           (sampler->
           super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
      SVar284 = SampleLd(this,(Interaction *)&rrBeta,&bssrdfSample.bsdf,lambda,
                         (SamplerHandle *)&local_328,&beta,&pdfUni);
      auVar87._8_56_ = auVar249;
      auVar87._0_8_ = SVar284.values.values._8_8_;
      auVar231._0_8_ = SVar284.values.values._0_8_;
      auVar231._8_56_ = auVar250;
      sigma_maj.values.values = (array<float,_4>)vmovlhps_avx(auVar231._0_16_,auVar87._0_16_);
      auVar250 = ZEXT856(sigma_maj.values.values._8_8_);
      SVar284 = SampledWavelengths::PDF(lambda);
      auVar88._8_56_ = auVar249;
      auVar88._0_8_ = SVar284.values.values._8_8_;
      auVar232._0_8_ = SVar284.values.values._0_8_;
      auVar232._8_56_ = auVar250;
      local_3d8.values.values = (array<float,_4>)vmovlhps_avx(auVar232._0_16_,auVar88._0_16_);
      auVar250 = ZEXT856(local_3d8.values.values._8_8_);
      SVar284 = SafeDiv(&sigma_maj,&local_3d8);
      auVar89._8_56_ = auVar249;
      auVar89._0_8_ = SVar284.values.values._8_8_;
      auVar233._0_8_ = SVar284.values.values._0_8_;
      auVar233._8_56_ = auVar250;
      auVar129 = vmovlhps_avx(auVar233._0_16_,auVar89._0_16_);
      sigma_a_3.values.values[0] = auVar129._0_4_;
      sigma_a_3.values.values[1] = auVar129._4_4_;
      sigma_a_3.values.values[2] = auVar129._8_4_;
      sigma_a_3.values.values[3] = auVar129._12_4_;
      SampledSpectrum::operator+=(&L,&sigma_a_3);
      FVar136 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                          ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                            *)sampler);
      uVar248 = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_858._8_8_ = 0;
      bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.x = (float)lVar123;
      bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.y = SUB84(lVar123,4);
      local_858._0_4_ = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.x;
      local_858._4_4_ = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.y;
      local_89c = fVar138;
      bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar248;
      auVar234._0_8_ =
           TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
      uVar23 = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar234._8_56_ = extraout_var_04;
      uVar248 = vmovlps_avx(auVar234._0_16_);
      sigma_a_3.values.values[0] = (float)uVar248;
      sigma_a_3.values.values[1] = (float)((ulong)uVar248 >> 0x20);
      woRender_01.super_Tuple3<pbrt::Vector3,_float>.z = local_89c;
      bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.x = (float)lVar123;
      bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.y = SUB84(lVar123,4);
      woRender_01.super_Tuple3<pbrt::Vector3,_float>.x =
           bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.x;
      woRender_01.super_Tuple3<pbrt::Vector3,_float>.y =
           bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar249 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar23;
      BSDF::Sample_f((BSDFSample *)&sigma_maj,&bssrdfSample.bsdf,woRender_01,FVar136,
                     (Point2f *)&sigma_a_3,Radiance,All);
      if (local_664 <= 0.0) goto LAB_00434d0e;
      tVar140 = AbsDot<float>(&local_670,(Normal3<float> *)((long)register0x00000020 + -0x5d8));
      auVar250 = extraout_var_05;
      SVar284 = SampledSpectrum::operator*(&sigma_maj,tVar140);
      auVar90._8_56_ = auVar249;
      auVar90._0_8_ = SVar284.values.values._8_8_;
      auVar235._0_8_ = SVar284.values.values._0_8_;
      auVar235._8_56_ = auVar250;
      auVar129 = vmovlhps_avx(auVar235._0_16_,auVar90._0_16_);
      sigma_a_3.values.values[0] = auVar129._0_4_;
      sigma_a_3.values.values[1] = auVar129._4_4_;
      sigma_a_3.values.values[2] = auVar129._8_4_;
      sigma_a_3.values.values[3] = auVar129._12_4_;
      SampledSpectrum::operator*=(&beta,&sigma_a_3);
      pdfNEE.values.values[0] = pdfUni.values.values[0];
      pdfNEE.values.values[1] = pdfUni.values.values[1];
      pdfNEE.values.values[2] = pdfUni.values.values[2];
      pdfNEE.values.values[3] = pdfUni.values.values[3];
      SampledSpectrum::operator*=(&pdfUni,local_664);
      specularBounce = (bool)((byte)local_660 >> 4 & 1);
      Interaction::SpawnRay((RayDifferential *)&sigma_a_3,(Interaction *)&rrBeta,&local_670);
      (ray_00->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = sigma_a_3.values.values[3];
      (ray_00->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = local_7a8;
      *(ulong *)&(ray_00->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
           CONCAT44(local_7a0,fStack_7a4);
      (ray_00->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = sigma_a_3.values.values[0];
      (ray_00->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = sigma_a_3.values.values[1];
      *(ulong *)&(ray_00->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
           CONCAT44(sigma_a_3.values.values[3],sigma_a_3.values.values[2]);
      (ray_00->super_Ray).medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (uintptr_t)
              local_798.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
      (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = fStack_77c;
      (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = fStack_778;
      (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = fStack_774;
      (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y = fStack_770;
      *(undefined8 *)&(ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = uStack_76c;
      (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y = TStack_764.x;
      (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = TStack_764.y;
      *(undefined8 *)&ray->hasDifferentials = local_790;
      (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = TStack_788.x;
      (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = TStack_788.y;
      (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = TStack_788.z;
      (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = fStack_77c;
      *(ulong *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
           CONCAT44(fStack_774,fStack_778);
    }
    in_ZMM5 = ZEXT1664(auVar130);
    in_ZMM12 = ZEXT1664(auVar128);
    bVar108 = SampledSpectrum::operator_cast_to_bool(&beta);
    if (!bVar108) goto LAB_00434d0e;
    auVar249 = ZEXT856((ulong)local_2e8._8_8_);
    fVar138 = local_2e8._0_4_ * (float)local_8b8._0_4_ * (float)local_8b8._0_4_;
    auVar134._16_48_ = auVar135;
    auVar134._0_16_ = ZEXT416((uint)fVar138);
    in_ZmmResult._4_60_ = auVar134._4_60_;
    in_ZmmResult._0_4_ =
         (Float)((uint)bVar106 * (int)local_2e8._0_4_ + (uint)!bVar106 * (int)fVar138);
    local_2e8 = in_ZmmResult._0_16_;
    auVar250 = ZEXT856(0);
    SVar284 = SampledSpectrum::operator*(&beta,in_ZmmResult._0_4_);
    auVar91._8_56_ = auVar249;
    auVar91._0_8_ = SVar284.values.values._8_8_;
    auVar236._0_8_ = SVar284.values.values._0_8_;
    auVar236._8_56_ = auVar250;
    intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
         vmovlhps_avx(auVar236._0_16_,auVar91._0_16_);
    FVar136 = SampledSpectrum::Average(&pdfUni);
    auVar250 = extraout_var_06;
    SVar284 = SampledSpectrum::operator/((SampledSpectrum *)&intr,FVar136);
    auVar92._8_56_ = auVar249;
    auVar92._0_8_ = SVar284.values.values._8_8_;
    auVar237._0_8_ = SVar284.values.values._0_8_;
    auVar237._8_56_ = auVar250;
    auVar130 = vmovlhps_avx(auVar237._0_16_,auVar92._0_16_);
    rrBeta.values.values._0_8_ = auVar130._0_8_;
    rrBeta.values.values[2] = auVar130._8_4_;
    rrBeta.values.values[3] = auVar130._12_4_;
    FVar136 = SampledSpectrum::MaxComponentValue(&rrBeta);
    in_ZMM1 = ZEXT464((uint)this->rrThreshold);
    if ((FVar136 < this->rrThreshold) && (1 < depth)) {
      FVar136 = SampledSpectrum::MaxComponentValue(&rrBeta);
      local_8b8._0_4_ = FVar136;
      FVar136 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                          ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                            *)sampler);
      auVar130 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_8b8._0_4_)),ZEXT416(0));
      in_ZMM1 = ZEXT1664(auVar130);
      if (FVar136 < auVar130._0_4_) goto LAB_00434d0e;
      fVar138 = 1.0 - auVar130._0_4_;
      local_8b8._0_4_ = fVar138;
      SampledSpectrum::operator*=(&pdfUni,fVar138);
      SampledSpectrum::operator*=(&pdfNEE,(Float)local_8b8._0_4_);
    }
    pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  } while( true );
LAB_00432f11:
  local_858._0_4_ = RNG::Uniform<float>((RNG *)&bssrdf);
  local_858._4_12_ = auVar55._4_12_;
  auVar145 = ZEXT464((uint)sigma_maj.values.values[0]);
  goto LAB_00432c3c;
}

Assistant:

SampledSpectrum VolPathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                      SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                      VisibleSurface *visibleSurface) const {
    // Declare state variables for volumetric path
    // NOTE: beta means something different here...
    SampledSpectrum L(0.f), beta(1.f), pdfUni(1.f), pdfNEE(1.f);
    bool specularBounce = false, anyNonSpecularBounces = false;
    Float etaScale = 1;
    pstd::optional<SurfaceInteraction> prevSurfaceIntr;
    pstd::optional<MediumInteraction> prevMediumIntr;
    int depth = 0;

    while (true) {
        // Sample segment of volumetric scattering path
        PBRT_DBG("%s\n", StringPrintf("Path tracer depth %d, current L = %s, beta = %s\n",
                                      depth, L, beta)
                             .c_str());
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        bool scattered = false, terminated = false;
        if (ray.medium) {
            // Sample the participating medium
            Float tMax = si ? si->tHit : Infinity;
            RNG rng(Hash(sampler.Get1D()), Hash(sampler.Get1D()));
            ray.medium.SampleTmaj(
                ray, tMax, rng, lambda, [&](const MediumSample &mediumSample) {
                    // Handle medium scattering event for ray
                    if (!beta) {
                        terminated = true;
                        return false;
                    }
                    rescale(beta, pdfUni, pdfNEE);
                    if (!mediumSample.intr) {
                        // Update _beta_ and _pdfUni_ for ray that escaped the medium
                        // FIXME: review this, esp the pdf...
                        beta *= mediumSample.Tmaj;
                        pdfUni *= mediumSample.Tmaj;
                        return false;
                    }
                    ++volumeInteractions;
                    const MediumInteraction &intr = *mediumSample.intr;
                    const SampledSpectrum &sigma_a = intr.sigma_a,
                                          &sigma_s = intr.sigma_s;
                    const SampledSpectrum &Tmaj = mediumSample.Tmaj;
                    // Add emission from medium scattering event
                    if (depth < maxDepth)
                        L += SafeDiv(
                            beta * intr.Le * sigma_a,
                            (intr.sigma_maj[0] * pdfUni.Average()) * lambda.PDF());

                    // Compute medium event probabilities for interaction
                    Float pAbsorb = sigma_a[0] / intr.sigma_maj[0];
                    Float pScatter = sigma_s[0] / intr.sigma_maj[0];
                    Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                    CHECK_GE(1 - pAbsorb - pScatter, -1e-6);
                    // Sample medium scattering event type and update path
                    Float um = rng.Uniform<Float>();
                    int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, um);
                    if (mode == 0) {
                        // Handle absorption along ray path
                        // beta *= Tmaj * sigma_a;
                        // pdfUni *= Tmaj * sigma_a;
                        terminated = true;
                        return false;

                    } else if (mode == 1) {
                        // Handle scattering along ray path
                        if (depth++ >= maxDepth) {
                            terminated = true;
                            return false;
                        }
                        beta *= Tmaj * sigma_s;
                        pdfUni *= Tmaj * sigma_s;
                        // Sample direct lighting at volume scattering event
                        L += SafeDiv(
                            SampleLd(intr, nullptr, lambda, sampler, beta, pdfUni),
                            lambda.PDF());

                        // Sample indirect lighting at volume scattering event
                        PhaseFunctionSample ps =
                            intr.phase.Sample_p(-ray.d, sampler.Get2D());
                        if (!ps) {
                            terminated = true;
                            return false;
                        }
                        // Update ray path state for indirect volume scattering
                        beta *= ps.p;
                        pdfNEE = pdfUni;
                        pdfUni *= ps.pdf;
                        prevMediumIntr = intr;
                        prevSurfaceIntr.reset();
                        scattered = true;
                        ray = intr.SpawnRay(ps.wi);
                        specularBounce = false;
                        anyNonSpecularBounces = true;

                        return false;

                    } else {
                        // Handle null scattering along ray path
                        SampledSpectrum sigma_n = intr.sigma_n();
                        beta *= Tmaj * sigma_n;
                        pdfUni *= Tmaj * sigma_n;
                        pdfNEE *= Tmaj * intr.sigma_maj;
                        rescale(beta, pdfUni, pdfNEE);
                        return true;
                    }
                });
        }
        if (terminated)
            return L;
        if (scattered)
            continue;
        // Handle scattering at point on surface for volumetric path tracer
        ++surfaceInteractions;
        if (depth > 0)
            CHECK(prevSurfaceIntr.has_value() ^ prevMediumIntr.has_value());
        // Add emitted light at volume path vertex or from the environment
        if (!si) {
            // Accumulate contributions from infinite light sources
            for (const auto &light : infiniteLights) {
                SampledSpectrum Le = light.Le(ray, lambda);
                if (Le) {
                    if (depth == 0 || specularBounce)
                        L += SafeDiv(beta * Le, pdfUni.Average() * lambda.PDF());
                    else {
                        // Add infinite light contribution using both PDFs with MIS
                        LightSampleContext prevIntrContext;
                        if (prevSurfaceIntr)
                            prevIntrContext = LightSampleContext(*prevSurfaceIntr);
                        else
                            prevIntrContext = LightSampleContext(*prevMediumIntr);
                        Float lightPDF = lightSampler.PDF(prevIntrContext, light) *
                                         light.PDF_Li(prevIntrContext, ray.d,
                                                      LightSamplingMode::WithMIS);
                        pdfNEE *= lightPDF;
                        L += SafeDiv(beta * Le,
                                     (pdfUni + pdfNEE).Average() * lambda.PDF());
                    }
                }
            }

            break;
        }
        SurfaceInteraction &isect = si->intr;
        SampledSpectrum Le = isect.Le(-ray.d, lambda);
        if (Le) {
            // Add contribution of emission from intersected surface
            if (depth == 0 || specularBounce)
                L += SafeDiv(beta * Le, pdfUni.Average() * lambda.PDF());
            else {
                // Add surface light contribution using both PDFs with MIS
                LightHandle areaLight(isect.areaLight);
                LightSampleContext prevIntrContext;
                if (prevSurfaceIntr)
                    prevIntrContext = LightSampleContext(*prevSurfaceIntr);
                else
                    prevIntrContext = LightSampleContext(*prevMediumIntr);
                Float lightPDF =
                    lightSampler.PDF(prevIntrContext, areaLight) *
                    areaLight.PDF_Li(prevIntrContext, ray.d, LightSamplingMode::WithMIS);
                pdfNEE *= lightPDF;
                L += SafeDiv(beta * Le, (pdfUni + pdfNEE).Average() * lambda.PDF());
            }
        }

        // Compute scattering functions and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        prevSurfaceIntr = isect;
        prevMediumIntr.reset();
        // Terminate path if maximum depth reached
        if (depth++ >= maxDepth)
            return L;

        // Possibly regularize BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }
        ++totalBSDFs;

        // Sample illumination from lights to find attenuated path contribution
        if (bsdf.IsNonSpecular()) {
            L += SafeDiv(SampleLd(isect, &bsdf, lambda, sampler, beta, pdfUni),
                         lambda.PDF());
            DCHECK(IsInf(L.y(lambda)) == false);
        }

        // Sample BSDF to get new volumetric path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        BSDFSample bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update _beta_ and PDFs for BSDF scattering
        beta *= bs.f * AbsDot(bs.wi, isect.shading.n);
        pdfNEE = pdfUni;
        if (bsdf.SampledPDFIsProportional()) {
            Float pdf = bsdf.PDF(wo, bs.wi);
            beta *= pdf / bs.pdf;
            pdfUni *= pdf;
        } else
            pdfUni *= bs.pdf;
        rescale(beta, pdfUni, pdfNEE);

        PBRT_DBG("%s\n", StringPrintf("Sampled BSDF, f = %s, pdf = %f -> beta = %s", bs.f,
                                      bs.pdf, beta)
                             .c_str());
        DCHECK(IsInf(beta.y(lambda)) == false);
        specularBounce = bs.IsSpecular();
        anyNonSpecularBounces |= !bs.IsSpecular();
        if (bs.IsTransmission())
            etaScale *= Sqr(bsdf.eta);
        ray = isect.SpawnRay(ray, bsdf, bs.wi, bs.flags);

        // Account for attenuated subsurface scattering, if applicable
        BSSRDFHandle bssrdf = isect.GetBSSRDF(ray, lambda, camera, scratchBuffer);
        if (bssrdf && bs.IsTransmission()) {
            // Sample BSSRDF probe segment to find exit point
            BSSRDFProbeSegment probeSeg = bssrdf.Sample(sampler.Get1D(), sampler.Get2D());
            if (!probeSeg)
                break;

            // Sample random intersection along BSSRDF probe segment
            uint64_t seed = MixBits(FloatToBits(sampler.Get1D()));
            WeightedReservoirSampler<SubsurfaceInteraction> interactionSampler(seed);
            // Intersect BSSRDF sampling ray against the scene geometry
            Interaction base(probeSeg.p0, probeSeg.time, (MediumHandle) nullptr);
            while (true) {
                Ray r = base.SpawnRayTo(probeSeg.p1);
                if (r.d == Vector3f(0, 0, 0))
                    break;
                pstd::optional<ShapeIntersection> si = Intersect(r, 1);
                if (!si)
                    break;
                base = si->intr;
                if (si->intr.material == isect.material)
                    interactionSampler.Add(SubsurfaceInteraction(si->intr), 1.f);
            }

            if (!interactionSampler.HasSample())
                break;

            // Convert probe intersection to _BSSRDFSample_ and update _beta_
            SubsurfaceInteraction ssi = interactionSampler.GetSample();
            BSSRDFSample bssrdfSample =
                bssrdf.ProbeIntersectionToSample(ssi, scratchBuffer);
            if (!bssrdfSample.S || bssrdfSample.pdf == 0)
                break;
            // Can ignore path pdf here as well since bssrdfSample.pdf
            // is non-spectral.
            beta *= bssrdfSample.S * interactionSampler.WeightSum() / bssrdfSample.pdf;
            SurfaceInteraction pi = ssi;
            BSDF &bsdf = bssrdfSample.bsdf;
            pi.wo = bssrdfSample.wo;

            // Possibly regularize subsurface BSDF and update _prevSurfaceIntr_
            anyNonSpecularBounces = true;
            if (regularize) {
                ++regularizedBSDFs;
                bsdf.Regularize();
            } else
                ++totalBSDFs;
            prevSurfaceIntr = pi;
            CHECK(!prevMediumIntr.has_value());

            // Account for attenuated direct subsurface scattering
            L +=
                SafeDiv(SampleLd(pi, &bsdf, lambda, sampler, beta, pdfUni), lambda.PDF());

            // Sample ray for indirect subsurface scattering
            Float u = sampler.Get1D();
            BSDFSample bs = bsdf.Sample_f(pi.wo, u, sampler.Get2D());
            if (!bs)
                break;
            beta *= bs.f * AbsDot(bs.wi, pi.shading.n);
            pdfNEE = pdfUni;
            pdfUni *= bs.pdf;
            // don't increment depth this time...
            DCHECK(!IsInf(beta.y(lambda)));
            specularBounce = bs.IsSpecular();
            ray = RayDifferential(pi.SpawnRay(bs.wi));
        }

        // Possibly terminate volumetric path with Russian roulette
        if (!beta)
            break;
        SampledSpectrum rrBeta = beta * etaScale / pdfUni.Average();
        PBRT_DBG("%s\n",
                 StringPrintf("etaScale %f -> rrBeta %s", etaScale, rrBeta).c_str());
        if (rrBeta.MaxComponentValue() < rrThreshold && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            pdfUni *= 1 - q;
            pdfNEE *= 1 - q;
        }
    }
    return L;
}